

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiMBIntersectorK<8,8>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  Primitive PVar3;
  Geometry *pGVar4;
  __int_type_conflict _Var5;
  long lVar6;
  long lVar7;
  RTCFilterFunctionN p_Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  int iVar21;
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [12];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  byte bVar59;
  byte bVar60;
  byte bVar61;
  byte bVar62;
  uint uVar63;
  ulong uVar64;
  byte bVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  int iVar69;
  byte bVar70;
  long lVar71;
  bool bVar72;
  bool bVar73;
  ulong uVar74;
  uint uVar75;
  uint uVar144;
  uint uVar145;
  uint uVar146;
  uint uVar147;
  uint uVar148;
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  uint uVar149;
  float pp;
  float fVar150;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar166;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar167 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [64];
  float fVar184;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar228;
  float fVar229;
  undefined1 auVar213 [16];
  float fVar230;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar219 [16];
  float fVar231;
  float fVar232;
  undefined1 auVar226 [32];
  undefined1 auVar225 [16];
  undefined1 auVar227 [32];
  float fVar233;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [32];
  float fVar246;
  undefined1 auVar244 [16];
  float fVar247;
  float fVar248;
  float fVar249;
  undefined1 auVar245 [32];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [32];
  undefined1 auVar255 [64];
  float fVar256;
  float fVar264;
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [32];
  float fVar262;
  float fVar263;
  undefined1 auVar260 [64];
  float fVar265;
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  float s;
  undefined1 auVar272 [32];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar273 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  float local_8e0;
  float fStack_8dc;
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  RTCFilterFunctionNArguments local_870;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [16];
  undefined1 local_7d0 [16];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [16];
  float local_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [16];
  Primitive *local_6b0;
  ulong local_6a8;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_570 [16];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  RTCHitN local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined4 local_4a0;
  undefined4 uStack_49c;
  undefined4 uStack_498;
  undefined4 uStack_494;
  undefined4 uStack_490;
  undefined4 uStack_48c;
  undefined4 uStack_488;
  undefined4 uStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined1 local_420 [32];
  uint local_400;
  uint uStack_3fc;
  uint uStack_3f8;
  uint uStack_3f4;
  uint uStack_3f0;
  uint uStack_3ec;
  uint uStack_3e8;
  uint uStack_3e4;
  uint local_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  uint uStack_3d0;
  uint uStack_3cc;
  uint uStack_3c8;
  uint uStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  byte abStack_180 [32];
  uint auStack_160 [7];
  float fStack_144;
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar124 [32];
  undefined1 auVar139 [32];
  undefined1 auVar143 [32];
  undefined1 auVar261 [64];
  
  PVar3 = prim[1];
  uVar64 = (ulong)(byte)PVar3;
  lVar22 = uVar64 * 0x25;
  fVar211 = *(float *)(prim + lVar22 + 0x12);
  auVar76 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar76 = vinsertps_avx(auVar76,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar17 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar81 = vinsertps_avx(auVar17,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar82 = vsubps_avx(auVar76,*(undefined1 (*) [16])(prim + lVar22 + 6));
  fVar210 = fVar211 * auVar82._0_4_;
  fVar150 = fVar211 * auVar81._0_4_;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar64 * 4 + 6);
  auVar93 = vpmovsxbd_avx2(auVar76);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar64 * 5 + 6);
  auVar90 = vpmovsxbd_avx2(auVar17);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar64 * 6 + 6);
  auVar91 = vpmovsxbd_avx2(auVar78);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar64 * 0xf + 6);
  auVar92 = vpmovsxbd_avx2(auVar86);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar99 = vpmovsxbd_avx2(auVar85);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar94 = vcvtdq2ps_avx(auVar99);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar64 + 6);
  auVar95 = vpmovsxbd_avx2(auVar2);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar64 * 0x1a + 6);
  auVar96 = vpmovsxbd_avx2(auVar77);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar64 * 0x1b + 6);
  auVar97 = vpmovsxbd_avx2(auVar79);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar64 * 0x1c + 6);
  auVar89 = vpmovsxbd_avx2(auVar80);
  auVar98 = vcvtdq2ps_avx(auVar89);
  auVar106._4_4_ = fVar150;
  auVar106._0_4_ = fVar150;
  auVar106._8_4_ = fVar150;
  auVar106._12_4_ = fVar150;
  auVar106._16_4_ = fVar150;
  auVar106._20_4_ = fVar150;
  auVar106._24_4_ = fVar150;
  auVar106._28_4_ = fVar150;
  auVar111._8_4_ = 1;
  auVar111._0_8_ = 0x100000001;
  auVar111._12_4_ = 1;
  auVar111._16_4_ = 1;
  auVar111._20_4_ = 1;
  auVar111._24_4_ = 1;
  auVar111._28_4_ = 1;
  auVar87 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar101 = ZEXT1632(CONCAT412(fVar211 * auVar81._12_4_,
                                CONCAT48(fVar211 * auVar81._8_4_,
                                         CONCAT44(fVar211 * auVar81._4_4_,fVar150))));
  auVar100 = vpermps_avx2(auVar111,auVar101);
  auVar88 = vpermps_avx512vl(auVar87,auVar101);
  fVar233 = auVar88._0_4_;
  fVar212 = auVar88._4_4_;
  auVar101._4_4_ = fVar212 * auVar91._4_4_;
  auVar101._0_4_ = fVar233 * auVar91._0_4_;
  fVar228 = auVar88._8_4_;
  auVar101._8_4_ = fVar228 * auVar91._8_4_;
  fVar229 = auVar88._12_4_;
  auVar101._12_4_ = fVar229 * auVar91._12_4_;
  fVar230 = auVar88._16_4_;
  auVar101._16_4_ = fVar230 * auVar91._16_4_;
  fVar231 = auVar88._20_4_;
  auVar101._20_4_ = fVar231 * auVar91._20_4_;
  fVar232 = auVar88._24_4_;
  auVar101._24_4_ = fVar232 * auVar91._24_4_;
  auVar101._28_4_ = auVar99._28_4_;
  auVar99._4_4_ = auVar95._4_4_ * fVar212;
  auVar99._0_4_ = auVar95._0_4_ * fVar233;
  auVar99._8_4_ = auVar95._8_4_ * fVar228;
  auVar99._12_4_ = auVar95._12_4_ * fVar229;
  auVar99._16_4_ = auVar95._16_4_ * fVar230;
  auVar99._20_4_ = auVar95._20_4_ * fVar231;
  auVar99._24_4_ = auVar95._24_4_ * fVar232;
  auVar99._28_4_ = auVar89._28_4_;
  auVar89._4_4_ = auVar98._4_4_ * fVar212;
  auVar89._0_4_ = auVar98._0_4_ * fVar233;
  auVar89._8_4_ = auVar98._8_4_ * fVar228;
  auVar89._12_4_ = auVar98._12_4_ * fVar229;
  auVar89._16_4_ = auVar98._16_4_ * fVar230;
  auVar89._20_4_ = auVar98._20_4_ * fVar231;
  auVar89._24_4_ = auVar98._24_4_ * fVar232;
  auVar89._28_4_ = auVar88._28_4_;
  auVar76 = vfmadd231ps_fma(auVar101,auVar100,auVar90);
  auVar17 = vfmadd231ps_fma(auVar99,auVar100,auVar94);
  auVar78 = vfmadd231ps_fma(auVar89,auVar97,auVar100);
  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar106,auVar93);
  auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar106,auVar92);
  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar96,auVar106);
  auVar110._4_4_ = fVar210;
  auVar110._0_4_ = fVar210;
  auVar110._8_4_ = fVar210;
  auVar110._12_4_ = fVar210;
  auVar110._16_4_ = fVar210;
  auVar110._20_4_ = fVar210;
  auVar110._24_4_ = fVar210;
  auVar110._28_4_ = fVar210;
  auVar89 = ZEXT1632(CONCAT412(fVar211 * auVar82._12_4_,
                               CONCAT48(fVar211 * auVar82._8_4_,
                                        CONCAT44(fVar211 * auVar82._4_4_,fVar210))));
  auVar99 = vpermps_avx2(auVar111,auVar89);
  auVar89 = vpermps_avx512vl(auVar87,auVar89);
  fVar211 = auVar89._0_4_;
  fVar233 = auVar89._4_4_;
  auVar100._4_4_ = fVar233 * auVar91._4_4_;
  auVar100._0_4_ = fVar211 * auVar91._0_4_;
  fVar212 = auVar89._8_4_;
  auVar100._8_4_ = fVar212 * auVar91._8_4_;
  fVar228 = auVar89._12_4_;
  auVar100._12_4_ = fVar228 * auVar91._12_4_;
  fVar229 = auVar89._16_4_;
  auVar100._16_4_ = fVar229 * auVar91._16_4_;
  fVar230 = auVar89._20_4_;
  auVar100._20_4_ = fVar230 * auVar91._20_4_;
  fVar231 = auVar89._24_4_;
  auVar100._24_4_ = fVar231 * auVar91._24_4_;
  auVar100._28_4_ = fVar150;
  auVar87._4_4_ = auVar95._4_4_ * fVar233;
  auVar87._0_4_ = auVar95._0_4_ * fVar211;
  auVar87._8_4_ = auVar95._8_4_ * fVar212;
  auVar87._12_4_ = auVar95._12_4_ * fVar228;
  auVar87._16_4_ = auVar95._16_4_ * fVar229;
  auVar87._20_4_ = auVar95._20_4_ * fVar230;
  auVar87._24_4_ = auVar95._24_4_ * fVar231;
  auVar87._28_4_ = auVar91._28_4_;
  auVar95._4_4_ = auVar98._4_4_ * fVar233;
  auVar95._0_4_ = auVar98._0_4_ * fVar211;
  auVar95._8_4_ = auVar98._8_4_ * fVar212;
  auVar95._12_4_ = auVar98._12_4_ * fVar228;
  auVar95._16_4_ = auVar98._16_4_ * fVar229;
  auVar95._20_4_ = auVar98._20_4_ * fVar230;
  auVar95._24_4_ = auVar98._24_4_ * fVar231;
  auVar95._28_4_ = auVar89._28_4_;
  auVar86 = vfmadd231ps_fma(auVar100,auVar99,auVar90);
  auVar85 = vfmadd231ps_fma(auVar87,auVar99,auVar94);
  auVar2 = vfmadd231ps_fma(auVar95,auVar99,auVar97);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar110,auVar93);
  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar110,auVar92);
  auVar108._8_4_ = 0x7fffffff;
  auVar108._0_8_ = 0x7fffffff7fffffff;
  auVar108._12_4_ = 0x7fffffff;
  auVar108._16_4_ = 0x7fffffff;
  auVar108._20_4_ = 0x7fffffff;
  auVar108._24_4_ = 0x7fffffff;
  auVar108._28_4_ = 0x7fffffff;
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar2),auVar110,auVar96);
  auVar93 = vandps_avx(ZEXT1632(auVar76),auVar108);
  auVar109._8_4_ = 0x219392ef;
  auVar109._0_8_ = 0x219392ef219392ef;
  auVar109._12_4_ = 0x219392ef;
  auVar109._16_4_ = 0x219392ef;
  auVar109._20_4_ = 0x219392ef;
  auVar109._24_4_ = 0x219392ef;
  auVar109._28_4_ = 0x219392ef;
  uVar74 = vcmpps_avx512vl(auVar93,auVar109,1);
  bVar72 = (bool)((byte)uVar74 & 1);
  auVar88._0_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar76._0_4_;
  bVar72 = (bool)((byte)(uVar74 >> 1) & 1);
  auVar88._4_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar76._4_4_;
  bVar72 = (bool)((byte)(uVar74 >> 2) & 1);
  auVar88._8_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar76._8_4_;
  bVar72 = (bool)((byte)(uVar74 >> 3) & 1);
  auVar88._12_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar76._12_4_;
  auVar88._16_4_ = (uint)((byte)(uVar74 >> 4) & 1) * 0x219392ef;
  auVar88._20_4_ = (uint)((byte)(uVar74 >> 5) & 1) * 0x219392ef;
  auVar88._24_4_ = (uint)((byte)(uVar74 >> 6) & 1) * 0x219392ef;
  auVar88._28_4_ = (uint)(byte)(uVar74 >> 7) * 0x219392ef;
  auVar93 = vandps_avx(ZEXT1632(auVar17),auVar108);
  uVar74 = vcmpps_avx512vl(auVar93,auVar109,1);
  bVar72 = (bool)((byte)uVar74 & 1);
  auVar102._0_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar17._0_4_;
  bVar72 = (bool)((byte)(uVar74 >> 1) & 1);
  auVar102._4_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar17._4_4_;
  bVar72 = (bool)((byte)(uVar74 >> 2) & 1);
  auVar102._8_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar17._8_4_;
  bVar72 = (bool)((byte)(uVar74 >> 3) & 1);
  auVar102._12_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar17._12_4_;
  auVar102._16_4_ = (uint)((byte)(uVar74 >> 4) & 1) * 0x219392ef;
  auVar102._20_4_ = (uint)((byte)(uVar74 >> 5) & 1) * 0x219392ef;
  auVar102._24_4_ = (uint)((byte)(uVar74 >> 6) & 1) * 0x219392ef;
  auVar102._28_4_ = (uint)(byte)(uVar74 >> 7) * 0x219392ef;
  auVar93 = vandps_avx(ZEXT1632(auVar78),auVar108);
  uVar74 = vcmpps_avx512vl(auVar93,auVar109,1);
  bVar72 = (bool)((byte)uVar74 & 1);
  auVar93._0_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar78._0_4_;
  bVar72 = (bool)((byte)(uVar74 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar78._4_4_;
  bVar72 = (bool)((byte)(uVar74 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar78._8_4_;
  bVar72 = (bool)((byte)(uVar74 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar78._12_4_;
  auVar93._16_4_ = (uint)((byte)(uVar74 >> 4) & 1) * 0x219392ef;
  auVar93._20_4_ = (uint)((byte)(uVar74 >> 5) & 1) * 0x219392ef;
  auVar93._24_4_ = (uint)((byte)(uVar74 >> 6) & 1) * 0x219392ef;
  auVar93._28_4_ = (uint)(byte)(uVar74 >> 7) * 0x219392ef;
  auVar90 = vrcp14ps_avx512vl(auVar88);
  auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar273 = ZEXT3264(auVar91);
  auVar92 = vfnmadd213ps_avx512vl(auVar88,auVar90,auVar91);
  auVar76 = vfmadd132ps_fma(auVar92,auVar90,auVar90);
  auVar90 = vrcp14ps_avx512vl(auVar102);
  auVar92 = vfnmadd213ps_avx512vl(auVar102,auVar90,auVar91);
  auVar17 = vfmadd132ps_fma(auVar92,auVar90,auVar90);
  auVar90 = vrcp14ps_avx512vl(auVar93);
  auVar93 = vfnmadd213ps_avx512vl(auVar93,auVar90,auVar91);
  auVar78 = vfmadd132ps_fma(auVar93,auVar90,auVar90);
  fVar211 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar22 + 0x16)) *
            *(float *)(prim + lVar22 + 0x1a);
  auVar107._4_4_ = fVar211;
  auVar107._0_4_ = fVar211;
  auVar107._8_4_ = fVar211;
  auVar107._12_4_ = fVar211;
  auVar107._16_4_ = fVar211;
  auVar107._20_4_ = fVar211;
  auVar107._24_4_ = fVar211;
  auVar107._28_4_ = fVar211;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar64 * 7 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar64 * 0xb + 6));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,auVar93);
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar64 * 9 + 6));
  auVar86 = vfmadd213ps_fma(auVar90,auVar107,auVar93);
  auVar93 = vcvtdq2ps_avx(auVar91);
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar64 * 0xd + 6));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,auVar93);
  auVar85 = vfmadd213ps_fma(auVar90,auVar107,auVar93);
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar64 * 0x12 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  uVar74 = (ulong)(uint)((int)(uVar64 * 5) << 2);
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar64 * 2 + uVar74 + 6));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,auVar93);
  auVar2 = vfmadd213ps_fma(auVar90,auVar107,auVar93);
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar64 * 0x18 + 6));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,auVar93);
  auVar77 = vfmadd213ps_fma(auVar90,auVar107,auVar93);
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar64 * 0x1d + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar64 + (ulong)(byte)PVar3 * 0x20 + 6));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,auVar93);
  auVar79 = vfmadd213ps_fma(auVar90,auVar107,auVar93);
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar3 * 0x20 - uVar64) + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar64 * 0x23 + 6));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,auVar93);
  auVar80 = vfmadd213ps_fma(auVar90,auVar107,auVar93);
  auVar93 = vsubps_avx(ZEXT1632(auVar86),ZEXT1632(auVar81));
  auVar96._4_4_ = auVar76._4_4_ * auVar93._4_4_;
  auVar96._0_4_ = auVar76._0_4_ * auVar93._0_4_;
  auVar96._8_4_ = auVar76._8_4_ * auVar93._8_4_;
  auVar96._12_4_ = auVar76._12_4_ * auVar93._12_4_;
  auVar96._16_4_ = auVar93._16_4_ * 0.0;
  auVar96._20_4_ = auVar93._20_4_ * 0.0;
  auVar96._24_4_ = auVar93._24_4_ * 0.0;
  auVar96._28_4_ = auVar93._28_4_;
  auVar93 = vsubps_avx(ZEXT1632(auVar85),ZEXT1632(auVar81));
  auVar105._0_4_ = auVar76._0_4_ * auVar93._0_4_;
  auVar105._4_4_ = auVar76._4_4_ * auVar93._4_4_;
  auVar105._8_4_ = auVar76._8_4_ * auVar93._8_4_;
  auVar105._12_4_ = auVar76._12_4_ * auVar93._12_4_;
  auVar105._16_4_ = auVar93._16_4_ * 0.0;
  auVar105._20_4_ = auVar93._20_4_ * 0.0;
  auVar105._24_4_ = auVar93._24_4_ * 0.0;
  auVar105._28_4_ = 0;
  auVar93 = vsubps_avx(ZEXT1632(auVar2),ZEXT1632(auVar82));
  auVar97._4_4_ = auVar17._4_4_ * auVar93._4_4_;
  auVar97._0_4_ = auVar17._0_4_ * auVar93._0_4_;
  auVar97._8_4_ = auVar17._8_4_ * auVar93._8_4_;
  auVar97._12_4_ = auVar17._12_4_ * auVar93._12_4_;
  auVar97._16_4_ = auVar93._16_4_ * 0.0;
  auVar97._20_4_ = auVar93._20_4_ * 0.0;
  auVar97._24_4_ = auVar93._24_4_ * 0.0;
  auVar97._28_4_ = auVar93._28_4_;
  auVar93 = vsubps_avx(ZEXT1632(auVar77),ZEXT1632(auVar82));
  auVar104._0_4_ = auVar17._0_4_ * auVar93._0_4_;
  auVar104._4_4_ = auVar17._4_4_ * auVar93._4_4_;
  auVar104._8_4_ = auVar17._8_4_ * auVar93._8_4_;
  auVar104._12_4_ = auVar17._12_4_ * auVar93._12_4_;
  auVar104._16_4_ = auVar93._16_4_ * 0.0;
  auVar104._20_4_ = auVar93._20_4_ * 0.0;
  auVar104._24_4_ = auVar93._24_4_ * 0.0;
  auVar104._28_4_ = 0;
  auVar93 = vsubps_avx(ZEXT1632(auVar79),ZEXT1632(auVar83));
  auVar98._4_4_ = auVar78._4_4_ * auVar93._4_4_;
  auVar98._0_4_ = auVar78._0_4_ * auVar93._0_4_;
  auVar98._8_4_ = auVar78._8_4_ * auVar93._8_4_;
  auVar98._12_4_ = auVar78._12_4_ * auVar93._12_4_;
  auVar98._16_4_ = auVar93._16_4_ * 0.0;
  auVar98._20_4_ = auVar93._20_4_ * 0.0;
  auVar98._24_4_ = auVar93._24_4_ * 0.0;
  auVar98._28_4_ = auVar93._28_4_;
  auVar93 = vsubps_avx(ZEXT1632(auVar80),ZEXT1632(auVar83));
  auVar103._0_4_ = auVar78._0_4_ * auVar93._0_4_;
  auVar103._4_4_ = auVar78._4_4_ * auVar93._4_4_;
  auVar103._8_4_ = auVar78._8_4_ * auVar93._8_4_;
  auVar103._12_4_ = auVar78._12_4_ * auVar93._12_4_;
  auVar103._16_4_ = auVar93._16_4_ * 0.0;
  auVar103._20_4_ = auVar93._20_4_ * 0.0;
  auVar103._24_4_ = auVar93._24_4_ * 0.0;
  auVar103._28_4_ = 0;
  auVar93 = vpminsd_avx2(auVar96,auVar105);
  auVar90 = vpminsd_avx2(auVar97,auVar104);
  auVar93 = vmaxps_avx(auVar93,auVar90);
  auVar90 = vpminsd_avx2(auVar98,auVar103);
  uVar166 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar91._4_4_ = uVar166;
  auVar91._0_4_ = uVar166;
  auVar91._8_4_ = uVar166;
  auVar91._12_4_ = uVar166;
  auVar91._16_4_ = uVar166;
  auVar91._20_4_ = uVar166;
  auVar91._24_4_ = uVar166;
  auVar91._28_4_ = uVar166;
  auVar90 = vmaxps_avx512vl(auVar90,auVar91);
  auVar93 = vmaxps_avx(auVar93,auVar90);
  auVar90._8_4_ = 0x3f7ffffa;
  auVar90._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar90._12_4_ = 0x3f7ffffa;
  auVar90._16_4_ = 0x3f7ffffa;
  auVar90._20_4_ = 0x3f7ffffa;
  auVar90._24_4_ = 0x3f7ffffa;
  auVar90._28_4_ = 0x3f7ffffa;
  local_340 = vmulps_avx512vl(auVar93,auVar90);
  auVar93 = vpmaxsd_avx2(auVar96,auVar105);
  auVar90 = vpmaxsd_avx2(auVar97,auVar104);
  auVar93 = vminps_avx(auVar93,auVar90);
  auVar90 = vpmaxsd_avx2(auVar98,auVar103);
  uVar166 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar92._4_4_ = uVar166;
  auVar92._0_4_ = uVar166;
  auVar92._8_4_ = uVar166;
  auVar92._12_4_ = uVar166;
  auVar92._16_4_ = uVar166;
  auVar92._20_4_ = uVar166;
  auVar92._24_4_ = uVar166;
  auVar92._28_4_ = uVar166;
  auVar90 = vminps_avx512vl(auVar90,auVar92);
  auVar93 = vminps_avx(auVar93,auVar90);
  auVar94._8_4_ = 0x3f800003;
  auVar94._0_8_ = 0x3f8000033f800003;
  auVar94._12_4_ = 0x3f800003;
  auVar94._16_4_ = 0x3f800003;
  auVar94._20_4_ = 0x3f800003;
  auVar94._24_4_ = 0x3f800003;
  auVar94._28_4_ = 0x3f800003;
  auVar93 = vmulps_avx512vl(auVar93,auVar94);
  auVar90 = vpbroadcastd_avx512vl();
  uVar19 = vpcmpgtd_avx512vl(auVar90,_DAT_01fe9900);
  uVar18 = vcmpps_avx512vl(local_340,auVar93,2);
  if ((byte)((byte)uVar18 & (byte)uVar19) == 0) {
    return false;
  }
  local_6a8 = (ulong)(byte)((byte)uVar18 & (byte)uVar19);
  local_560 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_6b0 = prim;
LAB_01e72589:
  lVar22 = 0;
  for (uVar74 = local_6a8; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x8000000000000000) {
    lVar22 = lVar22 + 1;
  }
  uVar66 = *(uint *)(local_6b0 + 2);
  pGVar4 = (context->scene->geometries).items[uVar66].ptr;
  uVar74 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           (ulong)*(uint *)(local_6b0 + lVar22 * 4 + 6) *
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar211 = (pGVar4->time_range).lower;
  fVar211 = pGVar4->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar211) / ((pGVar4->time_range).upper - fVar211));
  auVar76 = vroundss_avx(ZEXT416((uint)fVar211),ZEXT416((uint)fVar211),9);
  auVar76 = vminss_avx(auVar76,ZEXT416((uint)(pGVar4->fnumTimeSegments + -1.0)));
  auVar76 = vmaxss_avx(ZEXT816(0) << 0x20,auVar76);
  fVar211 = fVar211 - auVar76._0_4_;
  _Var5 = pGVar4[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar71 = (long)(int)auVar76._0_4_ * 0x38;
  lVar22 = *(long *)(_Var5 + 0x10 + lVar71);
  lVar6 = *(long *)(_Var5 + 0x38 + lVar71);
  lVar7 = *(long *)(_Var5 + 0x48 + lVar71);
  pfVar1 = (float *)(lVar6 + uVar74 * lVar7);
  auVar82._0_4_ = fVar211 * *pfVar1;
  auVar82._4_4_ = fVar211 * pfVar1[1];
  auVar82._8_4_ = fVar211 * pfVar1[2];
  auVar82._12_4_ = fVar211 * pfVar1[3];
  pfVar1 = (float *)(lVar6 + (uVar74 + 1) * lVar7);
  auVar83._0_4_ = fVar211 * *pfVar1;
  auVar83._4_4_ = fVar211 * pfVar1[1];
  auVar83._8_4_ = fVar211 * pfVar1[2];
  auVar83._12_4_ = fVar211 * pfVar1[3];
  pfVar1 = (float *)(lVar6 + (uVar74 + 2) * lVar7);
  auVar185._0_4_ = fVar211 * *pfVar1;
  auVar185._4_4_ = fVar211 * pfVar1[1];
  auVar185._8_4_ = fVar211 * pfVar1[2];
  auVar185._12_4_ = fVar211 * pfVar1[3];
  pfVar1 = (float *)(lVar6 + lVar7 * (uVar74 + 3));
  auVar213._0_4_ = fVar211 * *pfVar1;
  auVar213._4_4_ = fVar211 * pfVar1[1];
  auVar213._8_4_ = fVar211 * pfVar1[2];
  auVar213._12_4_ = fVar211 * pfVar1[3];
  lVar6 = *(long *)(_Var5 + lVar71);
  fVar211 = 1.0 - fVar211;
  auVar84._4_4_ = fVar211;
  auVar84._0_4_ = fVar211;
  auVar84._8_4_ = fVar211;
  auVar84._12_4_ = fVar211;
  auVar78 = vfmadd231ps_fma(auVar82,auVar84,*(undefined1 (*) [16])(lVar6 + lVar22 * uVar74));
  auVar86 = vfmadd231ps_fma(auVar83,auVar84,*(undefined1 (*) [16])(lVar6 + lVar22 * (uVar74 + 1)));
  auVar85 = vfmadd231ps_fma(auVar185,auVar84,*(undefined1 (*) [16])(lVar6 + lVar22 * (uVar74 + 2)));
  auVar76 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar17 = vinsertps_avx(auVar76,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_500 = vpbroadcastd_avx512vl();
  uVar166 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar270._4_4_ = uVar166;
  auVar270._0_4_ = uVar166;
  auVar270._8_4_ = uVar166;
  auVar270._12_4_ = uVar166;
  local_5e0._16_4_ = uVar166;
  local_5e0._0_16_ = auVar270;
  local_5e0._20_4_ = uVar166;
  local_5e0._24_4_ = uVar166;
  local_5e0._28_4_ = uVar166;
  uVar166 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar271._4_4_ = uVar166;
  auVar271._0_4_ = uVar166;
  auVar271._8_4_ = uVar166;
  auVar271._12_4_ = uVar166;
  local_600._16_4_ = uVar166;
  local_600._0_16_ = auVar271;
  local_600._20_4_ = uVar166;
  local_600._24_4_ = uVar166;
  local_600._28_4_ = uVar166;
  auVar76 = vunpcklps_avx(auVar270,auVar271);
  local_620 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xc0)));
  auVar79 = local_620._0_16_;
  local_7d0 = vinsertps_avx512f(auVar76,auVar79,0x28);
  auVar266 = ZEXT1664(local_7d0);
  fVar211 = *(float *)(ray + k * 4 + 0x60);
  auVar267 = ZEXT464((uint)fVar211);
  auVar244._0_4_ = auVar78._0_4_ + auVar86._0_4_;
  auVar244._4_4_ = auVar78._4_4_ + auVar86._4_4_;
  auVar244._8_4_ = auVar78._8_4_ + auVar86._8_4_;
  auVar244._12_4_ = auVar78._12_4_ + auVar86._12_4_;
  auVar81._8_4_ = 0x3f000000;
  auVar81._0_8_ = 0x3f0000003f000000;
  auVar81._12_4_ = 0x3f000000;
  local_2a0._16_16_ = local_620._16_16_;
  auVar76 = vmulps_avx512vl(auVar244,auVar81);
  auVar76 = vsubps_avx(auVar76,auVar17);
  auVar76 = vdpps_avx(auVar76,local_7d0,0x7f);
  local_7e0 = vdpps_avx(local_7d0,local_7d0,0x7f);
  auVar250._4_12_ = ZEXT812(0) << 0x20;
  auVar250._0_4_ = local_7e0._0_4_;
  auVar77 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar250);
  auVar2 = vfnmadd213ss_fma(auVar77,local_7e0,ZEXT416(0x40000000));
  fVar150 = auVar76._0_4_ * auVar2._0_4_ * auVar77._0_4_;
  auVar251._4_4_ = fVar150;
  auVar251._0_4_ = fVar150;
  auVar251._8_4_ = fVar150;
  auVar251._12_4_ = fVar150;
  auVar76 = vfmadd231ps_fma(auVar17,local_7d0,auVar251);
  auVar76 = vblendps_avx(auVar76,ZEXT816(0) << 0x40,8);
  auVar17 = vsubps_avx(auVar78,auVar76);
  auVar255 = ZEXT1664(auVar17);
  auVar78 = vsubps_avx(auVar85,auVar76);
  auVar260 = ZEXT1664(auVar78);
  auVar85 = vfmadd231ps_fma(auVar213,auVar84,*(undefined1 (*) [16])(lVar6 + lVar22 * (uVar74 + 3)));
  auVar86 = vsubps_avx(auVar86,auVar76);
  auVar76 = vsubps_avx(auVar85,auVar76);
  auVar93 = vbroadcastss_avx512vl(auVar17);
  auVar113._8_4_ = 1;
  auVar113._0_8_ = 0x100000001;
  auVar113._12_4_ = 1;
  auVar113._16_4_ = 1;
  auVar113._20_4_ = 1;
  auVar113._24_4_ = 1;
  auVar113._28_4_ = 1;
  local_760 = ZEXT1632(auVar17);
  auVar90 = vpermps_avx512vl(auVar113,local_760);
  auVar114._8_4_ = 2;
  auVar114._0_8_ = 0x200000002;
  auVar114._12_4_ = 2;
  auVar114._16_4_ = 2;
  auVar114._20_4_ = 2;
  auVar114._24_4_ = 2;
  auVar114._28_4_ = 2;
  auVar91 = vpermps_avx512vl(auVar114,local_760);
  auVar115._8_4_ = 3;
  auVar115._0_8_ = 0x300000003;
  auVar115._12_4_ = 3;
  auVar115._16_4_ = 3;
  auVar115._20_4_ = 3;
  auVar115._24_4_ = 3;
  auVar115._28_4_ = 3;
  auVar92 = vpermps_avx512vl(auVar115,local_760);
  auVar94 = vbroadcastss_avx512vl(auVar86);
  local_7a0 = ZEXT1632(auVar86);
  auVar95 = vpermps_avx512vl(auVar113,local_7a0);
  auVar96 = vpermps_avx512vl(auVar114,local_7a0);
  auVar97 = vpermps_avx512vl(auVar115,local_7a0);
  auVar98 = vbroadcastss_avx512vl(auVar78);
  local_780 = ZEXT1632(auVar78);
  auVar99 = vpermps_avx512vl(auVar113,local_780);
  local_2c0 = vpermps_avx512vl(auVar114,local_780);
  local_220 = vpermps_avx2(auVar115,local_780);
  uVar166 = auVar76._0_4_;
  local_2e0._4_4_ = uVar166;
  local_2e0._0_4_ = uVar166;
  local_2e0._8_4_ = uVar166;
  local_2e0._12_4_ = uVar166;
  local_2e0._16_4_ = uVar166;
  local_2e0._20_4_ = uVar166;
  local_2e0._24_4_ = uVar166;
  local_2e0._28_4_ = uVar166;
  _local_7c0 = ZEXT1632(auVar76);
  local_300 = vpermps_avx512vl(auVar113,_local_7c0);
  local_240 = vpermps_avx2(auVar114,_local_7c0);
  _local_260 = vpermps_avx2(auVar115,_local_7c0);
  local_2a0._0_16_ = vmulss_avx512f(auVar79,auVar79);
  auVar76 = vfmadd231ps_fma(ZEXT1632(local_2a0._0_16_),local_600,local_600);
  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),local_5e0,local_5e0);
  local_280._0_4_ = auVar76._0_4_;
  local_280._4_4_ = local_280._0_4_;
  local_280._8_4_ = local_280._0_4_;
  local_280._12_4_ = local_280._0_4_;
  local_280._16_4_ = local_280._0_4_;
  local_280._20_4_ = local_280._0_4_;
  local_280._24_4_ = local_280._0_4_;
  local_280._28_4_ = local_280._0_4_;
  auVar112._8_4_ = 0x7fffffff;
  auVar112._0_8_ = 0x7fffffff7fffffff;
  auVar112._12_4_ = 0x7fffffff;
  auVar112._16_4_ = 0x7fffffff;
  auVar112._20_4_ = 0x7fffffff;
  auVar112._24_4_ = 0x7fffffff;
  auVar112._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_280,auVar112);
  local_6f0 = ZEXT416((uint)fVar150);
  local_320 = fVar211 - fVar150;
  fStack_31c = local_320;
  fStack_318 = local_320;
  fStack_314 = local_320;
  fStack_310 = local_320;
  fStack_30c = local_320;
  fStack_308 = local_320;
  fStack_304 = local_320;
  uVar67 = 0;
  bVar72 = false;
  iVar69 = 1;
  local_520 = vpbroadcastd_avx512vl();
  auVar76 = vsqrtss_avx(local_7e0,local_7e0);
  auVar17 = vsqrtss_avx(local_7e0,local_7e0);
  auVar183 = ZEXT1664(ZEXT816(0x3f80000000000000));
  do {
    local_570 = auVar183._0_16_;
    auVar78 = vmovshdup_avx(local_570);
    auVar78 = vsubps_avx(auVar78,local_570);
    auVar159._0_4_ = auVar78._0_4_;
    fVar233 = auVar159._0_4_ * 0.04761905;
    uVar166 = auVar183._0_4_;
    auVar236._4_4_ = uVar166;
    auVar236._0_4_ = uVar166;
    auVar236._8_4_ = uVar166;
    auVar236._12_4_ = uVar166;
    auVar236._16_4_ = uVar166;
    auVar236._20_4_ = uVar166;
    auVar236._24_4_ = uVar166;
    auVar236._28_4_ = uVar166;
    auVar159._4_4_ = auVar159._0_4_;
    auVar159._8_4_ = auVar159._0_4_;
    auVar159._12_4_ = auVar159._0_4_;
    auVar159._16_4_ = auVar159._0_4_;
    auVar159._20_4_ = auVar159._0_4_;
    auVar159._24_4_ = auVar159._0_4_;
    auVar159._28_4_ = auVar159._0_4_;
    auVar78 = vfmadd231ps_fma(auVar236,auVar159,_DAT_01faff20);
    auVar272 = auVar273._0_32_;
    auVar89 = vsubps_avx512vl(auVar272,ZEXT1632(auVar78));
    fVar212 = auVar78._0_4_;
    fVar228 = auVar78._4_4_;
    fVar229 = auVar78._8_4_;
    fVar230 = auVar78._12_4_;
    fVar232 = auVar89._0_4_;
    fVar210 = auVar89._4_4_;
    fVar246 = auVar89._8_4_;
    fVar247 = auVar89._12_4_;
    fVar248 = auVar89._16_4_;
    fVar184 = auVar89._20_4_;
    fVar249 = auVar89._24_4_;
    auVar122._4_4_ = fVar210 * fVar210 * -fVar228;
    auVar122._0_4_ = fVar232 * fVar232 * -fVar212;
    auVar122._8_4_ = fVar246 * fVar246 * -fVar229;
    auVar122._12_4_ = fVar247 * fVar247 * -fVar230;
    auVar122._16_4_ = fVar248 * fVar248 * -0.0;
    auVar122._20_4_ = fVar184 * fVar184 * -0.0;
    auVar122._24_4_ = fVar249 * fVar249 * -0.0;
    auVar122._28_4_ = 0x80000000;
    auVar255._0_28_ =
         ZEXT1628(CONCAT412(fVar230 * fVar230,
                            CONCAT48(fVar229 * fVar229,CONCAT44(fVar228 * fVar228,fVar212 * fVar212)
                                    )));
    fVar256 = fVar212 * 3.0;
    fVar262 = fVar228 * 3.0;
    fVar263 = fVar229 * 3.0;
    fVar264 = fVar230 * 3.0;
    auVar261._28_36_ = auVar260._28_36_;
    auVar261._0_28_ = ZEXT1628(CONCAT412(fVar264,CONCAT48(fVar263,CONCAT44(fVar262,fVar256))));
    fVar265 = auVar260._28_4_ + -5.0;
    auVar178._0_4_ = (fVar256 + -5.0) * fVar212 * fVar212 + 2.0;
    auVar178._4_4_ = (fVar262 + -5.0) * fVar228 * fVar228 + 2.0;
    auVar178._8_4_ = (fVar263 + -5.0) * fVar229 * fVar229 + 2.0;
    auVar178._12_4_ = (fVar264 + -5.0) * fVar230 * fVar230 + 2.0;
    auVar178._16_4_ = 0x40000000;
    auVar178._20_4_ = 0x40000000;
    auVar178._24_4_ = 0x40000000;
    auVar178._28_4_ = auVar183._28_4_ + 2.0;
    auVar183._0_4_ = fVar232 * fVar232;
    auVar183._4_4_ = fVar210 * fVar210;
    auVar183._8_4_ = fVar246 * fVar246;
    auVar183._12_4_ = fVar247 * fVar247;
    auVar183._16_4_ = fVar248 * fVar248;
    auVar183._20_4_ = fVar184 * fVar184;
    auVar183._28_36_ = auVar266._28_36_;
    auVar183._24_4_ = fVar249 * fVar249;
    auVar204._0_4_ = auVar183._0_4_ * (fVar232 * 3.0 + -5.0) + 2.0;
    auVar204._4_4_ = auVar183._4_4_ * (fVar210 * 3.0 + -5.0) + 2.0;
    auVar204._8_4_ = auVar183._8_4_ * (fVar246 * 3.0 + -5.0) + 2.0;
    auVar204._12_4_ = auVar183._12_4_ * (fVar247 * 3.0 + -5.0) + 2.0;
    auVar204._16_4_ = auVar183._16_4_ * (fVar248 * 3.0 + -5.0) + 2.0;
    auVar204._20_4_ = auVar183._20_4_ * (fVar184 * 3.0 + -5.0) + 2.0;
    auVar204._24_4_ = auVar183._24_4_ * (fVar249 * 3.0 + -5.0) + 2.0;
    auVar204._28_4_ = auVar267._28_4_ + -5.0 + 2.0;
    fVar231 = auVar89._28_4_;
    auVar123._4_4_ = fVar228 * fVar228 * -fVar210;
    auVar123._0_4_ = fVar212 * fVar212 * -fVar232;
    auVar123._8_4_ = fVar229 * fVar229 * -fVar246;
    auVar123._12_4_ = fVar230 * fVar230 * -fVar247;
    auVar123._16_4_ = -fVar248 * 0.0 * 0.0;
    auVar123._20_4_ = -fVar184 * 0.0 * 0.0;
    auVar123._24_4_ = -fVar249 * 0.0 * 0.0;
    auVar123._28_4_ = -fVar231;
    auVar87 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar89 = vmulps_avx512vl(auVar122,auVar87);
    auVar88 = vmulps_avx512vl(auVar178,auVar87);
    auVar100 = vmulps_avx512vl(auVar204,auVar87);
    auVar101 = vmulps_avx512vl(auVar123,auVar87);
    auVar102 = vmulps_avx512vl(local_2e0,auVar101);
    auVar103 = vmulps_avx512vl(local_300,auVar101);
    auVar104 = vmulps_avx512vl(local_240,auVar101);
    auVar126._4_4_ = (float)local_260._4_4_ * auVar101._4_4_;
    auVar126._0_4_ = (float)local_260._0_4_ * auVar101._0_4_;
    auVar126._8_4_ = fStack_258 * auVar101._8_4_;
    auVar126._12_4_ = fStack_254 * auVar101._12_4_;
    auVar126._16_4_ = fStack_250 * auVar101._16_4_;
    auVar126._20_4_ = fStack_24c * auVar101._20_4_;
    auVar126._24_4_ = fStack_248 * auVar101._24_4_;
    auVar126._28_4_ = auVar101._28_4_;
    auVar101 = vfmadd231ps_avx512vl(auVar102,auVar100,auVar98);
    auVar102 = vfmadd231ps_avx512vl(auVar103,auVar100,auVar99);
    auVar103 = vfmadd231ps_avx512vl(auVar104,auVar100,local_2c0);
    auVar100 = vfmadd231ps_avx512vl(auVar126,local_220,auVar100);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar88,auVar94);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar88,auVar95);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar88,auVar96);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar97,auVar88);
    local_640 = vfmadd231ps_avx512vl(auVar101,auVar89,auVar93);
    local_740 = vfmadd231ps_avx512vl(auVar102,auVar89,auVar90);
    auVar102 = vfmadd231ps_avx512vl(auVar103,auVar89,auVar91);
    auVar103 = vfmadd231ps_avx512vl(auVar100,auVar92,auVar89);
    auVar127._4_4_ = (fVar210 + fVar210) * fVar228;
    auVar127._0_4_ = (fVar232 + fVar232) * fVar212;
    auVar127._8_4_ = (fVar246 + fVar246) * fVar229;
    auVar127._12_4_ = (fVar247 + fVar247) * fVar230;
    auVar127._16_4_ = (fVar248 + fVar248) * 0.0;
    auVar127._20_4_ = (fVar184 + fVar184) * 0.0;
    auVar127._24_4_ = (fVar249 + fVar249) * 0.0;
    auVar127._28_4_ = auVar88._28_4_;
    auVar89 = vsubps_avx(auVar127,auVar183._0_32_);
    auVar237._0_28_ =
         ZEXT1628(CONCAT412((fVar230 + fVar230) * (fVar264 + -5.0) + fVar264 * fVar230,
                            CONCAT48((fVar229 + fVar229) * (fVar263 + -5.0) + fVar263 * fVar229,
                                     CONCAT44((fVar228 + fVar228) * (fVar262 + -5.0) +
                                              fVar262 * fVar228,
                                              (fVar212 + fVar212) * (fVar256 + -5.0) +
                                              fVar256 * fVar212))));
    auVar237._28_4_ = fVar265 + 0.0;
    auVar116._8_4_ = 0x40000000;
    auVar116._0_8_ = 0x4000000040000000;
    auVar116._12_4_ = 0x40000000;
    auVar116._16_4_ = 0x40000000;
    auVar116._20_4_ = 0x40000000;
    auVar116._24_4_ = 0x40000000;
    auVar116._28_4_ = 0x40000000;
    auVar100 = vaddps_avx512vl(auVar261._0_32_,auVar116);
    auVar128._4_4_ = (fVar210 + fVar210) * auVar100._4_4_;
    auVar128._0_4_ = (fVar232 + fVar232) * auVar100._0_4_;
    auVar128._8_4_ = (fVar246 + fVar246) * auVar100._8_4_;
    auVar128._12_4_ = (fVar247 + fVar247) * auVar100._12_4_;
    auVar128._16_4_ = (fVar248 + fVar248) * auVar100._16_4_;
    auVar128._20_4_ = (fVar184 + fVar184) * auVar100._20_4_;
    auVar128._24_4_ = (fVar249 + fVar249) * auVar100._24_4_;
    auVar128._28_4_ = auVar100._28_4_;
    auVar129._4_4_ = fVar210 * 3.0 * fVar210;
    auVar129._0_4_ = fVar232 * 3.0 * fVar232;
    auVar129._8_4_ = fVar246 * 3.0 * fVar246;
    auVar129._12_4_ = fVar247 * 3.0 * fVar247;
    auVar129._16_4_ = fVar248 * 3.0 * fVar248;
    auVar129._20_4_ = fVar184 * 3.0 * fVar184;
    auVar129._24_4_ = fVar249 * 3.0 * fVar249;
    auVar129._28_4_ = fVar231;
    auVar100 = vsubps_avx(auVar128,auVar129);
    auVar101 = vsubps_avx(auVar255._0_32_,auVar127);
    auVar89 = vmulps_avx512vl(auVar89,auVar87);
    auVar104 = vmulps_avx512vl(auVar237,auVar87);
    auVar100 = vmulps_avx512vl(auVar100,auVar87);
    auVar101 = vmulps_avx512vl(auVar101,auVar87);
    auVar37._4_4_ = local_2e0._4_4_ * auVar101._4_4_;
    auVar37._0_4_ = local_2e0._0_4_ * auVar101._0_4_;
    auVar37._8_4_ = local_2e0._8_4_ * auVar101._8_4_;
    auVar37._12_4_ = local_2e0._12_4_ * auVar101._12_4_;
    auVar37._16_4_ = local_2e0._16_4_ * auVar101._16_4_;
    auVar37._20_4_ = local_2e0._20_4_ * auVar101._20_4_;
    auVar37._24_4_ = local_2e0._24_4_ * auVar101._24_4_;
    auVar37._28_4_ = fVar265;
    auVar87 = vmulps_avx512vl(local_300,auVar101);
    auVar105 = vmulps_avx512vl(local_240,auVar101);
    auVar38._4_4_ = (float)local_260._4_4_ * auVar101._4_4_;
    auVar38._0_4_ = (float)local_260._0_4_ * auVar101._0_4_;
    auVar38._8_4_ = fStack_258 * auVar101._8_4_;
    auVar38._12_4_ = fStack_254 * auVar101._12_4_;
    auVar38._16_4_ = fStack_250 * auVar101._16_4_;
    auVar38._20_4_ = fStack_24c * auVar101._20_4_;
    auVar38._24_4_ = fStack_248 * auVar101._24_4_;
    auVar38._28_4_ = auVar101._28_4_;
    auVar101 = vfmadd231ps_avx512vl(auVar37,auVar100,auVar98);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar100,auVar99);
    auVar78 = vfmadd231ps_fma(auVar105,auVar100,local_2c0);
    auVar100 = vfmadd231ps_avx512vl(auVar38,local_220,auVar100);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar104,auVar94);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar104,auVar95);
    auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar78),auVar104,auVar96);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar97,auVar104);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar89,auVar93);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar89,auVar90);
    auVar104 = vfmadd231ps_avx512vl(auVar105,auVar89,auVar91);
    auVar89 = vfmadd231ps_avx512vl(auVar100,auVar92,auVar89);
    auVar39._4_4_ = auVar101._4_4_ * fVar233;
    auVar39._0_4_ = auVar101._0_4_ * fVar233;
    auVar39._8_4_ = auVar101._8_4_ * fVar233;
    auVar39._12_4_ = auVar101._12_4_ * fVar233;
    auVar39._16_4_ = auVar101._16_4_ * fVar233;
    auVar39._20_4_ = auVar101._20_4_ * fVar233;
    auVar39._24_4_ = auVar101._24_4_ * fVar233;
    auVar39._28_4_ = fVar231 + fVar231;
    auVar40._4_4_ = auVar87._4_4_ * fVar233;
    auVar40._0_4_ = auVar87._0_4_ * fVar233;
    auVar40._8_4_ = auVar87._8_4_ * fVar233;
    auVar40._12_4_ = auVar87._12_4_ * fVar233;
    auVar40._16_4_ = auVar87._16_4_ * fVar233;
    auVar40._20_4_ = auVar87._20_4_ * fVar233;
    auVar40._24_4_ = auVar87._24_4_ * fVar233;
    auVar40._28_4_ = auVar88._28_4_;
    auVar41._4_4_ = auVar104._4_4_ * fVar233;
    auVar41._0_4_ = auVar104._0_4_ * fVar233;
    auVar41._8_4_ = auVar104._8_4_ * fVar233;
    auVar41._12_4_ = auVar104._12_4_ * fVar233;
    auVar41._16_4_ = auVar104._16_4_ * fVar233;
    auVar41._20_4_ = auVar104._20_4_ * fVar233;
    auVar41._24_4_ = auVar104._24_4_ * fVar233;
    auVar41._28_4_ = 0;
    fVar212 = fVar233 * auVar89._0_4_;
    fVar228 = fVar233 * auVar89._4_4_;
    auVar42._4_4_ = fVar228;
    auVar42._0_4_ = fVar212;
    fVar229 = fVar233 * auVar89._8_4_;
    auVar42._8_4_ = fVar229;
    fVar230 = fVar233 * auVar89._12_4_;
    auVar42._12_4_ = fVar230;
    fVar231 = fVar233 * auVar89._16_4_;
    auVar42._16_4_ = fVar231;
    fVar232 = fVar233 * auVar89._20_4_;
    auVar42._20_4_ = fVar232;
    fVar210 = fVar233 * auVar89._24_4_;
    auVar42._24_4_ = fVar210;
    auVar42._28_4_ = fVar233;
    auVar78 = vxorps_avx512vl(auVar97._0_16_,auVar97._0_16_);
    auVar88 = vpermt2ps_avx512vl(local_640,_DAT_01feed00,ZEXT1632(auVar78));
    auVar104 = vpermt2ps_avx512vl(local_740,_DAT_01feed00,ZEXT1632(auVar78));
    auVar266 = ZEXT3264(auVar104);
    auVar101 = ZEXT1632(auVar78);
    auVar105 = vpermt2ps_avx512vl(auVar102,_DAT_01feed00,auVar101);
    auVar267 = ZEXT3264(auVar105);
    auVar238._0_4_ = auVar103._0_4_ + fVar212;
    auVar238._4_4_ = auVar103._4_4_ + fVar228;
    auVar238._8_4_ = auVar103._8_4_ + fVar229;
    auVar238._12_4_ = auVar103._12_4_ + fVar230;
    auVar238._16_4_ = auVar103._16_4_ + fVar231;
    auVar238._20_4_ = auVar103._20_4_ + fVar232;
    auVar238._24_4_ = auVar103._24_4_ + fVar210;
    auVar238._28_4_ = auVar103._28_4_ + fVar233;
    auVar89 = vmaxps_avx(auVar103,auVar238);
    auVar100 = vminps_avx(auVar103,auVar238);
    auVar103 = vpermt2ps_avx512vl(auVar103,_DAT_01feed00,auVar101);
    auVar106 = vpermt2ps_avx512vl(auVar39,_DAT_01feed00,auVar101);
    auVar260 = ZEXT3264(auVar106);
    auVar107 = vpermt2ps_avx512vl(auVar40,_DAT_01feed00,auVar101);
    auVar122 = ZEXT1632(auVar78);
    auVar108 = vpermt2ps_avx512vl(auVar41,_DAT_01feed00,auVar122);
    auVar101 = vpermt2ps_avx512vl(auVar42,_DAT_01feed00,auVar122);
    auVar109 = vsubps_avx512vl(auVar103,auVar101);
    auVar110 = vsubps_avx512vl(auVar88,local_640);
    auVar255 = ZEXT3264(auVar110);
    auVar101 = vsubps_avx(auVar104,local_740);
    auVar87 = vsubps_avx(auVar105,auVar102);
    auVar111 = vmulps_avx512vl(auVar101,auVar41);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar40,auVar87);
    auVar112 = vmulps_avx512vl(auVar87,auVar39);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar41,auVar110);
    auVar113 = vmulps_avx512vl(auVar110,auVar40);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar39,auVar101);
    auVar113 = vmulps_avx512vl(auVar113,auVar113);
    auVar112 = vfmadd231ps_avx512vl(auVar113,auVar112,auVar112);
    auVar111 = vfmadd231ps_avx512vl(auVar112,auVar111,auVar111);
    auVar112 = vmulps_avx512vl(auVar87,auVar87);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar101,auVar101);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar110,auVar110);
    auVar113 = vrcp14ps_avx512vl(auVar112);
    auVar114 = vfnmadd213ps_avx512vl(auVar113,auVar112,auVar272);
    auVar113 = vfmadd132ps_avx512vl(auVar114,auVar113,auVar113);
    auVar111 = vmulps_avx512vl(auVar111,auVar113);
    auVar114 = vmulps_avx512vl(auVar101,auVar108);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar107,auVar87);
    auVar115 = vmulps_avx512vl(auVar87,auVar106);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar108,auVar110);
    auVar116 = vmulps_avx512vl(auVar110,auVar107);
    auVar116 = vfmsub231ps_avx512vl(auVar116,auVar106,auVar101);
    auVar116 = vmulps_avx512vl(auVar116,auVar116);
    auVar115 = vfmadd231ps_avx512vl(auVar116,auVar115,auVar115);
    auVar114 = vfmadd231ps_avx512vl(auVar115,auVar114,auVar114);
    auVar113 = vmulps_avx512vl(auVar114,auVar113);
    auVar111 = vmaxps_avx512vl(auVar111,auVar113);
    auVar111 = vsqrtps_avx512vl(auVar111);
    auVar113 = vmaxps_avx512vl(auVar109,auVar103);
    auVar89 = vmaxps_avx512vl(auVar89,auVar113);
    auVar113 = vaddps_avx512vl(auVar111,auVar89);
    auVar89 = vminps_avx512vl(auVar109,auVar103);
    auVar89 = vminps_avx(auVar100,auVar89);
    auVar89 = vsubps_avx512vl(auVar89,auVar111);
    auVar117._8_4_ = 0x3f800002;
    auVar117._0_8_ = 0x3f8000023f800002;
    auVar117._12_4_ = 0x3f800002;
    auVar117._16_4_ = 0x3f800002;
    auVar117._20_4_ = 0x3f800002;
    auVar117._24_4_ = 0x3f800002;
    auVar117._28_4_ = 0x3f800002;
    auVar100 = vmulps_avx512vl(auVar113,auVar117);
    auVar118._8_4_ = 0x3f7ffffc;
    auVar118._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar118._12_4_ = 0x3f7ffffc;
    auVar118._16_4_ = 0x3f7ffffc;
    auVar118._20_4_ = 0x3f7ffffc;
    auVar118._24_4_ = 0x3f7ffffc;
    auVar118._28_4_ = 0x3f7ffffc;
    auVar89 = vmulps_avx512vl(auVar89,auVar118);
    auVar100 = vmulps_avx512vl(auVar100,auVar100);
    auVar103 = vrsqrt14ps_avx512vl(auVar112);
    auVar119._8_4_ = 0xbf000000;
    auVar119._0_8_ = 0xbf000000bf000000;
    auVar119._12_4_ = 0xbf000000;
    auVar119._16_4_ = 0xbf000000;
    auVar119._20_4_ = 0xbf000000;
    auVar119._24_4_ = 0xbf000000;
    auVar119._28_4_ = 0xbf000000;
    auVar109 = vmulps_avx512vl(auVar112,auVar119);
    fVar233 = auVar103._0_4_;
    fVar212 = auVar103._4_4_;
    fVar228 = auVar103._8_4_;
    fVar229 = auVar103._12_4_;
    fVar230 = auVar103._16_4_;
    fVar231 = auVar103._20_4_;
    fVar232 = auVar103._24_4_;
    auVar43._4_4_ = fVar212 * fVar212 * fVar212 * auVar109._4_4_;
    auVar43._0_4_ = fVar233 * fVar233 * fVar233 * auVar109._0_4_;
    auVar43._8_4_ = fVar228 * fVar228 * fVar228 * auVar109._8_4_;
    auVar43._12_4_ = fVar229 * fVar229 * fVar229 * auVar109._12_4_;
    auVar43._16_4_ = fVar230 * fVar230 * fVar230 * auVar109._16_4_;
    auVar43._20_4_ = fVar231 * fVar231 * fVar231 * auVar109._20_4_;
    auVar43._24_4_ = fVar232 * fVar232 * fVar232 * auVar109._24_4_;
    auVar43._28_4_ = auVar113._28_4_;
    auVar120._8_4_ = 0x3fc00000;
    auVar120._0_8_ = 0x3fc000003fc00000;
    auVar120._12_4_ = 0x3fc00000;
    auVar120._16_4_ = 0x3fc00000;
    auVar120._20_4_ = 0x3fc00000;
    auVar120._24_4_ = 0x3fc00000;
    auVar120._28_4_ = 0x3fc00000;
    auVar103 = vfmadd231ps_avx512vl(auVar43,auVar103,auVar120);
    auVar109 = vmulps_avx512vl(auVar110,auVar103);
    auVar111 = vmulps_avx512vl(auVar101,auVar103);
    auVar112 = vmulps_avx512vl(auVar87,auVar103);
    auVar113 = vsubps_avx512vl(auVar122,local_640);
    auVar114 = vsubps_avx512vl(auVar122,local_740);
    auVar115 = vsubps_avx512vl(auVar122,auVar102);
    auVar116 = vmulps_avx512vl(local_620,auVar115);
    auVar116 = vfmadd231ps_avx512vl(auVar116,local_600,auVar114);
    auVar116 = vfmadd231ps_avx512vl(auVar116,local_5e0,auVar113);
    auVar117 = vmulps_avx512vl(auVar115,auVar115);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar114,auVar114);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar113,auVar113);
    auVar118 = vmulps_avx512vl(local_620,auVar112);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar111,local_600);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar109,local_5e0);
    auVar112 = vmulps_avx512vl(auVar115,auVar112);
    auVar111 = vfmadd231ps_avx512vl(auVar112,auVar114,auVar111);
    auVar109 = vfmadd231ps_avx512vl(auVar111,auVar113,auVar109);
    auVar111 = vmulps_avx512vl(auVar118,auVar118);
    auVar112 = vsubps_avx512vl(local_280,auVar111);
    auVar119 = vmulps_avx512vl(auVar118,auVar109);
    auVar116 = vsubps_avx512vl(auVar116,auVar119);
    auVar116 = vaddps_avx512vl(auVar116,auVar116);
    auVar119 = vmulps_avx512vl(auVar109,auVar109);
    local_680 = vsubps_avx512vl(auVar117,auVar119);
    auVar100 = vsubps_avx512vl(local_680,auVar100);
    local_660 = vmulps_avx512vl(auVar116,auVar116);
    auVar121._8_4_ = 0x40800000;
    auVar121._0_8_ = 0x4080000040800000;
    auVar121._12_4_ = 0x40800000;
    auVar121._16_4_ = 0x40800000;
    auVar121._20_4_ = 0x40800000;
    auVar121._24_4_ = 0x40800000;
    auVar121._28_4_ = 0x40800000;
    auVar117 = vmulps_avx512vl(auVar112,auVar121);
    auVar119 = vmulps_avx512vl(auVar117,auVar100);
    auVar119 = vsubps_avx512vl(local_660,auVar119);
    uVar74 = vcmpps_avx512vl(auVar119,auVar122,5);
    bVar59 = (byte)uVar74;
    if (bVar59 != 0) {
      auVar119 = vsqrtps_avx512vl(auVar119);
      auVar120 = vaddps_avx512vl(auVar112,auVar112);
      local_6a0 = vrcp14ps_avx512vl(auVar120);
      auVar121 = vfnmadd213ps_avx512vl(local_6a0,auVar120,auVar272);
      auVar121 = vfmadd132ps_avx512vl(auVar121,local_6a0,local_6a0);
      auVar272._8_4_ = 0x80000000;
      auVar272._0_8_ = 0x8000000080000000;
      auVar272._12_4_ = 0x80000000;
      auVar272._16_4_ = 0x80000000;
      auVar272._20_4_ = 0x80000000;
      auVar272._24_4_ = 0x80000000;
      auVar272._28_4_ = 0x80000000;
      local_800 = vxorps_avx512vl(auVar116,auVar272);
      auVar122 = vsubps_avx512vl(local_800,auVar119);
      auVar122 = vmulps_avx512vl(auVar122,auVar121);
      auVar119 = vsubps_avx512vl(auVar119,auVar116);
      auVar119 = vmulps_avx512vl(auVar119,auVar121);
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar123 = vblendmps_avx512vl(auVar121,auVar122);
      auVar124._0_4_ =
           (uint)(bVar59 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar121._0_4_;
      bVar73 = (bool)((byte)(uVar74 >> 1) & 1);
      auVar124._4_4_ = (uint)bVar73 * auVar123._4_4_ | (uint)!bVar73 * auVar121._4_4_;
      bVar73 = (bool)((byte)(uVar74 >> 2) & 1);
      auVar124._8_4_ = (uint)bVar73 * auVar123._8_4_ | (uint)!bVar73 * auVar121._8_4_;
      bVar73 = (bool)((byte)(uVar74 >> 3) & 1);
      auVar124._12_4_ = (uint)bVar73 * auVar123._12_4_ | (uint)!bVar73 * auVar121._12_4_;
      bVar73 = (bool)((byte)(uVar74 >> 4) & 1);
      auVar124._16_4_ = (uint)bVar73 * auVar123._16_4_ | (uint)!bVar73 * auVar121._16_4_;
      bVar73 = (bool)((byte)(uVar74 >> 5) & 1);
      auVar124._20_4_ = (uint)bVar73 * auVar123._20_4_ | (uint)!bVar73 * auVar121._20_4_;
      bVar73 = (bool)((byte)(uVar74 >> 6) & 1);
      auVar124._24_4_ = (uint)bVar73 * auVar123._24_4_ | (uint)!bVar73 * auVar121._24_4_;
      bVar73 = SUB81(uVar74 >> 7,0);
      auVar124._28_4_ = (uint)bVar73 * auVar123._28_4_ | (uint)!bVar73 * auVar121._28_4_;
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar123 = vblendmps_avx512vl(auVar121,auVar119);
      auVar125._0_4_ =
           (uint)(bVar59 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar121._0_4_;
      bVar73 = (bool)((byte)(uVar74 >> 1) & 1);
      auVar125._4_4_ = (uint)bVar73 * auVar123._4_4_ | (uint)!bVar73 * auVar121._4_4_;
      bVar73 = (bool)((byte)(uVar74 >> 2) & 1);
      auVar125._8_4_ = (uint)bVar73 * auVar123._8_4_ | (uint)!bVar73 * auVar121._8_4_;
      bVar73 = (bool)((byte)(uVar74 >> 3) & 1);
      auVar125._12_4_ = (uint)bVar73 * auVar123._12_4_ | (uint)!bVar73 * auVar121._12_4_;
      bVar73 = (bool)((byte)(uVar74 >> 4) & 1);
      auVar125._16_4_ = (uint)bVar73 * auVar123._16_4_ | (uint)!bVar73 * auVar121._16_4_;
      bVar73 = (bool)((byte)(uVar74 >> 5) & 1);
      auVar125._20_4_ = (uint)bVar73 * auVar123._20_4_ | (uint)!bVar73 * auVar121._20_4_;
      bVar73 = (bool)((byte)(uVar74 >> 6) & 1);
      auVar125._24_4_ = (uint)bVar73 * auVar123._24_4_ | (uint)!bVar73 * auVar121._24_4_;
      bVar73 = SUB81(uVar74 >> 7,0);
      auVar125._28_4_ = (uint)bVar73 * auVar123._28_4_ | (uint)!bVar73 * auVar121._28_4_;
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar111,auVar121);
      auVar111 = vmaxps_avx512vl(local_2a0,auVar121);
      auVar31._8_4_ = 0x36000000;
      auVar31._0_8_ = 0x3600000036000000;
      auVar31._12_4_ = 0x36000000;
      auVar31._16_4_ = 0x36000000;
      auVar31._20_4_ = 0x36000000;
      auVar31._24_4_ = 0x36000000;
      auVar31._28_4_ = 0x36000000;
      local_820 = vmulps_avx512vl(auVar111,auVar31);
      vandps_avx512vl(auVar112,auVar121);
      uVar64 = vcmpps_avx512vl(local_820,local_820,1);
      uVar74 = uVar74 & uVar64;
      bVar61 = (byte)uVar74;
      if (bVar61 != 0) {
        uVar64 = vcmpps_avx512vl(auVar100,_DAT_01faff00,2);
        auVar100 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar112 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar121 = vblendmps_avx512vl(auVar100,auVar112);
        bVar65 = (byte)uVar64;
        uVar75 = (uint)(bVar65 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar65 & 1) * local_820._0_4_;
        bVar73 = (bool)((byte)(uVar64 >> 1) & 1);
        uVar68 = (uint)bVar73 * auVar121._4_4_ | (uint)!bVar73 * local_820._4_4_;
        bVar73 = (bool)((byte)(uVar64 >> 2) & 1);
        uVar63 = (uint)bVar73 * auVar121._8_4_ | (uint)!bVar73 * local_820._8_4_;
        bVar73 = (bool)((byte)(uVar64 >> 3) & 1);
        uVar144 = (uint)bVar73 * auVar121._12_4_ | (uint)!bVar73 * local_820._12_4_;
        bVar73 = (bool)((byte)(uVar64 >> 4) & 1);
        uVar145 = (uint)bVar73 * auVar121._16_4_ | (uint)!bVar73 * local_820._16_4_;
        bVar73 = (bool)((byte)(uVar64 >> 5) & 1);
        uVar146 = (uint)bVar73 * auVar121._20_4_ | (uint)!bVar73 * local_820._20_4_;
        bVar73 = (bool)((byte)(uVar64 >> 6) & 1);
        uVar147 = (uint)bVar73 * auVar121._24_4_ | (uint)!bVar73 * local_820._24_4_;
        bVar73 = SUB81(uVar64 >> 7,0);
        uVar148 = (uint)bVar73 * auVar121._28_4_ | (uint)!bVar73 * local_820._28_4_;
        auVar124._0_4_ = (bVar61 & 1) * uVar75 | !(bool)(bVar61 & 1) * auVar124._0_4_;
        bVar73 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar124._4_4_ = bVar73 * uVar68 | !bVar73 * auVar124._4_4_;
        bVar73 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar124._8_4_ = bVar73 * uVar63 | !bVar73 * auVar124._8_4_;
        bVar73 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar124._12_4_ = bVar73 * uVar144 | !bVar73 * auVar124._12_4_;
        bVar73 = (bool)((byte)(uVar74 >> 4) & 1);
        auVar124._16_4_ = bVar73 * uVar145 | !bVar73 * auVar124._16_4_;
        bVar73 = (bool)((byte)(uVar74 >> 5) & 1);
        auVar124._20_4_ = bVar73 * uVar146 | !bVar73 * auVar124._20_4_;
        bVar73 = (bool)((byte)(uVar74 >> 6) & 1);
        auVar124._24_4_ = bVar73 * uVar147 | !bVar73 * auVar124._24_4_;
        bVar73 = SUB81(uVar74 >> 7,0);
        auVar124._28_4_ = bVar73 * uVar148 | !bVar73 * auVar124._28_4_;
        auVar100 = vblendmps_avx512vl(auVar112,auVar100);
        bVar73 = (bool)((byte)(uVar64 >> 1) & 1);
        bVar10 = (bool)((byte)(uVar64 >> 2) & 1);
        bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
        bVar14 = (bool)((byte)(uVar64 >> 4) & 1);
        bVar11 = (bool)((byte)(uVar64 >> 5) & 1);
        bVar13 = (bool)((byte)(uVar64 >> 6) & 1);
        bVar15 = SUB81(uVar64 >> 7,0);
        auVar125._0_4_ =
             (uint)(bVar61 & 1) *
             ((uint)(bVar65 & 1) * auVar100._0_4_ | !(bool)(bVar65 & 1) * uVar75) |
             !(bool)(bVar61 & 1) * auVar125._0_4_;
        bVar9 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar125._4_4_ =
             (uint)bVar9 * ((uint)bVar73 * auVar100._4_4_ | !bVar73 * uVar68) |
             !bVar9 * auVar125._4_4_;
        bVar73 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar125._8_4_ =
             (uint)bVar73 * ((uint)bVar10 * auVar100._8_4_ | !bVar10 * uVar63) |
             !bVar73 * auVar125._8_4_;
        bVar73 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar125._12_4_ =
             (uint)bVar73 * ((uint)bVar12 * auVar100._12_4_ | !bVar12 * uVar144) |
             !bVar73 * auVar125._12_4_;
        bVar73 = (bool)((byte)(uVar74 >> 4) & 1);
        auVar125._16_4_ =
             (uint)bVar73 * ((uint)bVar14 * auVar100._16_4_ | !bVar14 * uVar145) |
             !bVar73 * auVar125._16_4_;
        bVar73 = (bool)((byte)(uVar74 >> 5) & 1);
        auVar125._20_4_ =
             (uint)bVar73 * ((uint)bVar11 * auVar100._20_4_ | !bVar11 * uVar146) |
             !bVar73 * auVar125._20_4_;
        bVar73 = (bool)((byte)(uVar74 >> 6) & 1);
        auVar125._24_4_ =
             (uint)bVar73 * ((uint)bVar13 * auVar100._24_4_ | !bVar13 * uVar147) |
             !bVar73 * auVar125._24_4_;
        bVar73 = SUB81(uVar74 >> 7,0);
        auVar125._28_4_ =
             (uint)bVar73 * ((uint)bVar15 * auVar100._28_4_ | !bVar15 * uVar148) |
             !bVar73 * auVar125._28_4_;
        bVar59 = (~bVar61 | bVar65) & bVar59;
      }
      if ((bVar59 & 0x7f) == 0) {
        auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar273 = ZEXT3264(auVar89);
      }
      else {
        auVar100 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar108 = vxorps_avx512vl(auVar108,auVar100);
        auVar106 = vxorps_avx512vl(auVar106,auVar100);
        uVar75 = *(uint *)(ray + k * 4 + 0x100);
        auVar107 = vxorps_avx512vl(auVar107,auVar100);
        auVar78 = vsubss_avx512f(ZEXT416(uVar75),ZEXT416((uint)local_6f0._0_4_));
        auVar112 = vbroadcastss_avx512vl(auVar78);
        auVar112 = vminps_avx512vl(auVar112,auVar125);
        auVar58._4_4_ = fStack_31c;
        auVar58._0_4_ = local_320;
        auVar58._8_4_ = fStack_318;
        auVar58._12_4_ = fStack_314;
        auVar58._16_4_ = fStack_310;
        auVar58._20_4_ = fStack_30c;
        auVar58._24_4_ = fStack_308;
        auVar58._28_4_ = fStack_304;
        auVar121 = vmaxps_avx512vl(auVar58,auVar124);
        auVar115 = vmulps_avx512vl(auVar115,auVar41);
        auVar114 = vfmadd213ps_avx512vl(auVar114,auVar40,auVar115);
        auVar78 = vfmadd213ps_fma(auVar113,auVar39,auVar114);
        auVar113 = vmulps_avx512vl(local_620,auVar41);
        auVar86 = vfmadd231ps_fma(auVar113,local_600,auVar40);
        auVar113 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),local_5e0,auVar39);
        auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar113,auVar114);
        auVar115 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar18 = vcmpps_avx512vl(auVar114,auVar115,1);
        auVar123 = vxorps_avx512vl(ZEXT1632(auVar78),auVar100);
        auVar126 = vrcp14ps_avx512vl(auVar113);
        auVar127 = vxorps_avx512vl(auVar113,auVar100);
        auVar128 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar129 = vfnmadd213ps_avx512vl(auVar126,auVar113,auVar128);
        auVar78 = vfmadd132ps_fma(auVar129,auVar126,auVar126);
        fVar233 = auVar78._0_4_ * auVar123._0_4_;
        fVar212 = auVar78._4_4_ * auVar123._4_4_;
        auVar44._4_4_ = fVar212;
        auVar44._0_4_ = fVar233;
        fVar228 = auVar78._8_4_ * auVar123._8_4_;
        auVar44._8_4_ = fVar228;
        fVar229 = auVar78._12_4_ * auVar123._12_4_;
        auVar44._12_4_ = fVar229;
        fVar230 = auVar123._16_4_ * 0.0;
        auVar44._16_4_ = fVar230;
        fVar231 = auVar123._20_4_ * 0.0;
        auVar44._20_4_ = fVar231;
        fVar232 = auVar123._24_4_ * 0.0;
        auVar44._24_4_ = fVar232;
        auVar44._28_4_ = auVar123._28_4_;
        uVar19 = vcmpps_avx512vl(auVar113,auVar127,1);
        bVar61 = (byte)uVar18 | (byte)uVar19;
        auVar205._8_4_ = 0xff800000;
        auVar205._0_8_ = 0xff800000ff800000;
        auVar205._12_4_ = 0xff800000;
        auVar205._16_4_ = 0xff800000;
        auVar205._20_4_ = 0xff800000;
        auVar205._24_4_ = 0xff800000;
        auVar205._28_4_ = 0xff800000;
        auVar129 = vblendmps_avx512vl(auVar44,auVar205);
        auVar130._0_4_ =
             (uint)(bVar61 & 1) * auVar129._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar126._0_4_;
        bVar73 = (bool)(bVar61 >> 1 & 1);
        auVar130._4_4_ = (uint)bVar73 * auVar129._4_4_ | (uint)!bVar73 * auVar126._4_4_;
        bVar73 = (bool)(bVar61 >> 2 & 1);
        auVar130._8_4_ = (uint)bVar73 * auVar129._8_4_ | (uint)!bVar73 * auVar126._8_4_;
        bVar73 = (bool)(bVar61 >> 3 & 1);
        auVar130._12_4_ = (uint)bVar73 * auVar129._12_4_ | (uint)!bVar73 * auVar126._12_4_;
        bVar73 = (bool)(bVar61 >> 4 & 1);
        auVar130._16_4_ = (uint)bVar73 * auVar129._16_4_ | (uint)!bVar73 * auVar126._16_4_;
        bVar73 = (bool)(bVar61 >> 5 & 1);
        auVar130._20_4_ = (uint)bVar73 * auVar129._20_4_ | (uint)!bVar73 * auVar126._20_4_;
        bVar73 = (bool)(bVar61 >> 6 & 1);
        auVar130._24_4_ = (uint)bVar73 * auVar129._24_4_ | (uint)!bVar73 * auVar126._24_4_;
        auVar130._28_4_ =
             (uint)(bVar61 >> 7) * auVar129._28_4_ | (uint)!(bool)(bVar61 >> 7) * auVar126._28_4_;
        auVar126 = vmaxps_avx512vl(auVar121,auVar130);
        uVar19 = vcmpps_avx512vl(auVar113,auVar127,6);
        bVar61 = (byte)uVar18 | (byte)uVar19;
        auVar131._0_4_ = (uint)(bVar61 & 1) * 0x7f800000 | (uint)!(bool)(bVar61 & 1) * (int)fVar233;
        bVar73 = (bool)(bVar61 >> 1 & 1);
        auVar131._4_4_ = (uint)bVar73 * 0x7f800000 | (uint)!bVar73 * (int)fVar212;
        bVar73 = (bool)(bVar61 >> 2 & 1);
        auVar131._8_4_ = (uint)bVar73 * 0x7f800000 | (uint)!bVar73 * (int)fVar228;
        bVar73 = (bool)(bVar61 >> 3 & 1);
        auVar131._12_4_ = (uint)bVar73 * 0x7f800000 | (uint)!bVar73 * (int)fVar229;
        bVar73 = (bool)(bVar61 >> 4 & 1);
        auVar131._16_4_ = (uint)bVar73 * 0x7f800000 | (uint)!bVar73 * (int)fVar230;
        bVar73 = (bool)(bVar61 >> 5 & 1);
        auVar131._20_4_ = (uint)bVar73 * 0x7f800000 | (uint)!bVar73 * (int)fVar231;
        bVar73 = (bool)(bVar61 >> 6 & 1);
        auVar131._24_4_ = (uint)bVar73 * 0x7f800000 | (uint)!bVar73 * (int)fVar232;
        auVar131._28_4_ =
             (uint)(bVar61 >> 7) * 0x7f800000 | (uint)!(bool)(bVar61 >> 7) * auVar123._28_4_;
        auVar112 = vminps_avx512vl(auVar112,auVar131);
        auVar78 = vxorps_avx512vl(auVar121._0_16_,auVar121._0_16_);
        auVar88 = vsubps_avx512vl(ZEXT1632(auVar78),auVar88);
        auVar104 = vsubps_avx512vl(ZEXT1632(auVar78),auVar104);
        auVar113 = ZEXT1632(auVar78);
        auVar105 = vsubps_avx512vl(auVar113,auVar105);
        auVar105 = vmulps_avx512vl(auVar105,auVar108);
        auVar104 = vfmadd231ps_avx512vl(auVar105,auVar107,auVar104);
        auVar88 = vfmadd231ps_avx512vl(auVar104,auVar106,auVar88);
        auVar104 = vmulps_avx512vl(local_620,auVar108);
        auVar104 = vfmadd231ps_avx512vl(auVar104,local_600,auVar107);
        auVar104 = vfmadd231ps_avx512vl(auVar104,local_5e0,auVar106);
        vandps_avx512vl(auVar104,auVar114);
        uVar18 = vcmpps_avx512vl(auVar104,auVar115,1);
        auVar88 = vxorps_avx512vl(auVar88,auVar100);
        auVar105 = vrcp14ps_avx512vl(auVar104);
        auVar100 = vxorps_avx512vl(auVar104,auVar100);
        auVar267 = ZEXT3264(auVar100);
        auVar106 = vfnmadd213ps_avx512vl(auVar105,auVar104,auVar128);
        auVar78 = vfmadd132ps_fma(auVar106,auVar105,auVar105);
        fVar233 = auVar78._0_4_ * auVar88._0_4_;
        fVar212 = auVar78._4_4_ * auVar88._4_4_;
        auVar45._4_4_ = fVar212;
        auVar45._0_4_ = fVar233;
        fVar228 = auVar78._8_4_ * auVar88._8_4_;
        auVar45._8_4_ = fVar228;
        fVar229 = auVar78._12_4_ * auVar88._12_4_;
        auVar45._12_4_ = fVar229;
        fVar230 = auVar88._16_4_ * 0.0;
        auVar45._16_4_ = fVar230;
        fVar231 = auVar88._20_4_ * 0.0;
        auVar45._20_4_ = fVar231;
        fVar232 = auVar88._24_4_ * 0.0;
        auVar45._24_4_ = fVar232;
        auVar45._28_4_ = auVar88._28_4_;
        uVar19 = vcmpps_avx512vl(auVar104,auVar100,1);
        bVar61 = (byte)uVar18 | (byte)uVar19;
        auVar106 = vblendmps_avx512vl(auVar45,auVar205);
        auVar132._0_4_ =
             (uint)(bVar61 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar105._0_4_;
        bVar73 = (bool)(bVar61 >> 1 & 1);
        auVar132._4_4_ = (uint)bVar73 * auVar106._4_4_ | (uint)!bVar73 * auVar105._4_4_;
        bVar73 = (bool)(bVar61 >> 2 & 1);
        auVar132._8_4_ = (uint)bVar73 * auVar106._8_4_ | (uint)!bVar73 * auVar105._8_4_;
        bVar73 = (bool)(bVar61 >> 3 & 1);
        auVar132._12_4_ = (uint)bVar73 * auVar106._12_4_ | (uint)!bVar73 * auVar105._12_4_;
        bVar73 = (bool)(bVar61 >> 4 & 1);
        auVar132._16_4_ = (uint)bVar73 * auVar106._16_4_ | (uint)!bVar73 * auVar105._16_4_;
        bVar73 = (bool)(bVar61 >> 5 & 1);
        auVar132._20_4_ = (uint)bVar73 * auVar106._20_4_ | (uint)!bVar73 * auVar105._20_4_;
        bVar73 = (bool)(bVar61 >> 6 & 1);
        auVar132._24_4_ = (uint)bVar73 * auVar106._24_4_ | (uint)!bVar73 * auVar105._24_4_;
        auVar132._28_4_ =
             (uint)(bVar61 >> 7) * auVar106._28_4_ | (uint)!(bool)(bVar61 >> 7) * auVar105._28_4_;
        auVar266 = ZEXT3264(auVar132);
        _local_840 = vmaxps_avx(auVar126,auVar132);
        auVar260 = ZEXT3264(_local_840);
        uVar19 = vcmpps_avx512vl(auVar104,auVar100,6);
        bVar61 = (byte)uVar18 | (byte)uVar19;
        auVar133._0_4_ = (uint)(bVar61 & 1) * 0x7f800000 | (uint)!(bool)(bVar61 & 1) * (int)fVar233;
        bVar73 = (bool)(bVar61 >> 1 & 1);
        auVar133._4_4_ = (uint)bVar73 * 0x7f800000 | (uint)!bVar73 * (int)fVar212;
        bVar73 = (bool)(bVar61 >> 2 & 1);
        auVar133._8_4_ = (uint)bVar73 * 0x7f800000 | (uint)!bVar73 * (int)fVar228;
        bVar73 = (bool)(bVar61 >> 3 & 1);
        auVar133._12_4_ = (uint)bVar73 * 0x7f800000 | (uint)!bVar73 * (int)fVar229;
        bVar73 = (bool)(bVar61 >> 4 & 1);
        auVar133._16_4_ = (uint)bVar73 * 0x7f800000 | (uint)!bVar73 * (int)fVar230;
        bVar73 = (bool)(bVar61 >> 5 & 1);
        auVar133._20_4_ = (uint)bVar73 * 0x7f800000 | (uint)!bVar73 * (int)fVar231;
        bVar73 = (bool)(bVar61 >> 6 & 1);
        auVar133._24_4_ = (uint)bVar73 * 0x7f800000 | (uint)!bVar73 * (int)fVar232;
        auVar133._28_4_ =
             (uint)(bVar61 >> 7) * 0x7f800000 | (uint)!(bool)(bVar61 >> 7) * auVar88._28_4_;
        local_3a0 = vminps_avx(auVar112,auVar133);
        uVar18 = vcmpps_avx512vl(_local_840,local_3a0,2);
        bVar59 = bVar59 & 0x7f & (byte)uVar18;
        if (bVar59 == 0) {
          auVar273 = ZEXT3264(auVar128);
        }
        else {
          auVar100 = vmaxps_avx512vl(auVar113,auVar89);
          auVar89 = vfmadd213ps_avx512vl(auVar122,auVar118,auVar109);
          auVar89 = vmulps_avx512vl(auVar103,auVar89);
          auVar88 = vfmadd213ps_avx512vl(auVar119,auVar118,auVar109);
          auVar46._4_4_ = auVar103._4_4_ * auVar88._4_4_;
          auVar46._0_4_ = auVar103._0_4_ * auVar88._0_4_;
          auVar46._8_4_ = auVar103._8_4_ * auVar88._8_4_;
          auVar46._12_4_ = auVar103._12_4_ * auVar88._12_4_;
          auVar46._16_4_ = auVar103._16_4_ * auVar88._16_4_;
          auVar46._20_4_ = auVar103._20_4_ * auVar88._20_4_;
          auVar46._24_4_ = auVar103._24_4_ * auVar88._24_4_;
          auVar46._28_4_ = auVar132._28_4_;
          auVar89 = vminps_avx512vl(auVar89,auVar128);
          auVar53 = ZEXT812(0);
          auVar88 = ZEXT1232(auVar53) << 0x20;
          auVar89 = vmaxps_avx(auVar89,ZEXT1232(auVar53) << 0x20);
          auVar104 = vminps_avx512vl(auVar46,auVar128);
          auVar47._4_4_ = (auVar89._4_4_ + 1.0) * 0.125;
          auVar47._0_4_ = (auVar89._0_4_ + 0.0) * 0.125;
          auVar47._8_4_ = (auVar89._8_4_ + 2.0) * 0.125;
          auVar47._12_4_ = (auVar89._12_4_ + 3.0) * 0.125;
          auVar47._16_4_ = (auVar89._16_4_ + 4.0) * 0.125;
          auVar47._20_4_ = (auVar89._20_4_ + 5.0) * 0.125;
          auVar47._24_4_ = (auVar89._24_4_ + 6.0) * 0.125;
          auVar47._28_4_ = auVar89._28_4_ + 7.0;
          auVar78 = vfmadd213ps_fma(auVar47,auVar159,auVar236);
          local_1e0 = ZEXT1632(auVar78);
          auVar89 = vmaxps_avx(auVar104,ZEXT1232(auVar53) << 0x20);
          auVar48._4_4_ = (auVar89._4_4_ + 1.0) * 0.125;
          auVar48._0_4_ = (auVar89._0_4_ + 0.0) * 0.125;
          auVar48._8_4_ = (auVar89._8_4_ + 2.0) * 0.125;
          auVar48._12_4_ = (auVar89._12_4_ + 3.0) * 0.125;
          auVar48._16_4_ = (auVar89._16_4_ + 4.0) * 0.125;
          auVar48._20_4_ = (auVar89._20_4_ + 5.0) * 0.125;
          auVar48._24_4_ = (auVar89._24_4_ + 6.0) * 0.125;
          auVar48._28_4_ = auVar89._28_4_ + 7.0;
          auVar78 = vfmadd213ps_fma(auVar48,auVar159,auVar236);
          local_200 = ZEXT1632(auVar78);
          auVar49._4_4_ = auVar100._4_4_ * auVar100._4_4_;
          auVar49._0_4_ = auVar100._0_4_ * auVar100._0_4_;
          auVar49._8_4_ = auVar100._8_4_ * auVar100._8_4_;
          auVar49._12_4_ = auVar100._12_4_ * auVar100._12_4_;
          auVar49._16_4_ = auVar100._16_4_ * auVar100._16_4_;
          auVar49._20_4_ = auVar100._20_4_ * auVar100._20_4_;
          auVar49._24_4_ = auVar100._24_4_ * auVar100._24_4_;
          auVar49._28_4_ = auVar100._28_4_;
          auVar89 = vsubps_avx(local_680,auVar49);
          local_8e0 = auVar117._0_4_;
          fStack_8dc = auVar117._4_4_;
          fStack_8d8 = auVar117._8_4_;
          fStack_8d4 = auVar117._12_4_;
          fStack_8d0 = auVar117._16_4_;
          fStack_8cc = auVar117._20_4_;
          fStack_8c8 = auVar117._24_4_;
          auVar50._4_4_ = auVar89._4_4_ * fStack_8dc;
          auVar50._0_4_ = auVar89._0_4_ * local_8e0;
          auVar50._8_4_ = auVar89._8_4_ * fStack_8d8;
          auVar50._12_4_ = auVar89._12_4_ * fStack_8d4;
          auVar50._16_4_ = auVar89._16_4_ * fStack_8d0;
          auVar50._20_4_ = auVar89._20_4_ * fStack_8cc;
          auVar50._24_4_ = auVar89._24_4_ * fStack_8c8;
          auVar50._28_4_ = auVar100._28_4_;
          auVar100 = vsubps_avx(local_660,auVar50);
          uVar18 = vcmpps_avx512vl(auVar100,ZEXT1232(auVar53) << 0x20,5);
          bVar61 = (byte)uVar18;
          auVar273 = ZEXT3264(auVar128);
          if (bVar61 == 0) {
            bVar61 = 0;
            auVar101 = ZEXT1232(ZEXT812(0)) << 0x20;
            auVar183 = ZEXT864(0) << 0x20;
            auVar100 = ZEXT1232(ZEXT812(0)) << 0x20;
            auVar104 = SUB6432(ZEXT864(0),0) << 0x20;
            auVar266 = ZEXT864(0) << 0x20;
            auVar134._8_4_ = 0x7f800000;
            auVar134._0_8_ = 0x7f8000007f800000;
            auVar134._12_4_ = 0x7f800000;
            auVar134._16_4_ = 0x7f800000;
            auVar134._20_4_ = 0x7f800000;
            auVar134._24_4_ = 0x7f800000;
            auVar134._28_4_ = 0x7f800000;
            auVar135._8_4_ = 0xff800000;
            auVar135._0_8_ = 0xff800000ff800000;
            auVar135._12_4_ = 0xff800000;
            auVar135._16_4_ = 0xff800000;
            auVar135._20_4_ = 0xff800000;
            auVar135._24_4_ = 0xff800000;
            auVar135._28_4_ = 0xff800000;
          }
          else {
            uVar74 = vcmpps_avx512vl(auVar100,auVar113,5);
            auVar100 = vsqrtps_avx(auVar100);
            auVar88 = vfnmadd213ps_avx512vl(auVar120,local_6a0,auVar128);
            auVar105 = vfmadd132ps_avx512vl(auVar88,local_6a0,local_6a0);
            auVar88 = vsubps_avx(local_800,auVar100);
            auVar106 = vmulps_avx512vl(auVar88,auVar105);
            auVar100 = vsubps_avx512vl(auVar100,auVar116);
            auVar105 = vmulps_avx512vl(auVar100,auVar105);
            auVar100 = vfmadd213ps_avx512vl(auVar118,auVar106,auVar109);
            auVar51._4_4_ = auVar103._4_4_ * auVar100._4_4_;
            auVar51._0_4_ = auVar103._0_4_ * auVar100._0_4_;
            auVar51._8_4_ = auVar103._8_4_ * auVar100._8_4_;
            auVar51._12_4_ = auVar103._12_4_ * auVar100._12_4_;
            auVar51._16_4_ = auVar103._16_4_ * auVar100._16_4_;
            auVar51._20_4_ = auVar103._20_4_ * auVar100._20_4_;
            auVar51._24_4_ = auVar103._24_4_ * auVar100._24_4_;
            auVar51._28_4_ = auVar104._28_4_;
            auVar100 = vmulps_avx512vl(local_5e0,auVar106);
            auVar88 = vmulps_avx512vl(local_600,auVar106);
            auVar107 = vmulps_avx512vl(local_620,auVar106);
            auVar104 = vfmadd213ps_avx512vl(auVar110,auVar51,local_640);
            auVar100 = vsubps_avx512vl(auVar100,auVar104);
            auVar104 = vfmadd213ps_avx512vl(auVar101,auVar51,local_740);
            auVar104 = vsubps_avx512vl(auVar88,auVar104);
            auVar78 = vfmadd213ps_fma(auVar51,auVar87,auVar102);
            auVar88 = vsubps_avx(auVar107,ZEXT1632(auVar78));
            auVar266 = ZEXT3264(auVar88);
            auVar88 = vfmadd213ps_avx512vl(auVar118,auVar105,auVar109);
            auVar103 = vmulps_avx512vl(auVar103,auVar88);
            auVar88 = vmulps_avx512vl(local_5e0,auVar105);
            auVar107 = vmulps_avx512vl(local_600,auVar105);
            auVar108 = vmulps_avx512vl(local_620,auVar105);
            auVar78 = vfmadd213ps_fma(auVar110,auVar103,local_640);
            auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar78));
            auVar78 = vfmadd213ps_fma(auVar101,auVar103,local_740);
            auVar101 = vsubps_avx512vl(auVar107,ZEXT1632(auVar78));
            auVar78 = vfmadd213ps_fma(auVar87,auVar103,auVar102);
            auVar87 = vsubps_avx512vl(auVar108,ZEXT1632(auVar78));
            auVar183 = ZEXT3264(auVar87);
            auVar160._8_4_ = 0x7f800000;
            auVar160._0_8_ = 0x7f8000007f800000;
            auVar160._12_4_ = 0x7f800000;
            auVar160._16_4_ = 0x7f800000;
            auVar160._20_4_ = 0x7f800000;
            auVar160._24_4_ = 0x7f800000;
            auVar160._28_4_ = 0x7f800000;
            auVar87 = vblendmps_avx512vl(auVar160,auVar106);
            bVar73 = (bool)((byte)uVar74 & 1);
            auVar134._0_4_ = (uint)bVar73 * auVar87._0_4_ | (uint)!bVar73 * 0x7f800000;
            bVar73 = (bool)((byte)(uVar74 >> 1) & 1);
            auVar134._4_4_ = (uint)bVar73 * auVar87._4_4_ | (uint)!bVar73 * 0x7f800000;
            bVar73 = (bool)((byte)(uVar74 >> 2) & 1);
            auVar134._8_4_ = (uint)bVar73 * auVar87._8_4_ | (uint)!bVar73 * 0x7f800000;
            bVar73 = (bool)((byte)(uVar74 >> 3) & 1);
            auVar134._12_4_ = (uint)bVar73 * auVar87._12_4_ | (uint)!bVar73 * 0x7f800000;
            bVar73 = (bool)((byte)(uVar74 >> 4) & 1);
            auVar134._16_4_ = (uint)bVar73 * auVar87._16_4_ | (uint)!bVar73 * 0x7f800000;
            bVar73 = (bool)((byte)(uVar74 >> 5) & 1);
            auVar134._20_4_ = (uint)bVar73 * auVar87._20_4_ | (uint)!bVar73 * 0x7f800000;
            bVar73 = (bool)((byte)(uVar74 >> 6) & 1);
            auVar134._24_4_ = (uint)bVar73 * auVar87._24_4_ | (uint)!bVar73 * 0x7f800000;
            bVar73 = SUB81(uVar74 >> 7,0);
            auVar134._28_4_ = (uint)bVar73 * auVar87._28_4_ | (uint)!bVar73 * 0x7f800000;
            auVar206._8_4_ = 0xff800000;
            auVar206._0_8_ = 0xff800000ff800000;
            auVar206._12_4_ = 0xff800000;
            auVar206._16_4_ = 0xff800000;
            auVar206._20_4_ = 0xff800000;
            auVar206._24_4_ = 0xff800000;
            auVar206._28_4_ = 0xff800000;
            auVar87 = vblendmps_avx512vl(auVar206,auVar105);
            bVar73 = (bool)((byte)uVar74 & 1);
            auVar135._0_4_ = (uint)bVar73 * auVar87._0_4_ | (uint)!bVar73 * -0x800000;
            bVar73 = (bool)((byte)(uVar74 >> 1) & 1);
            auVar135._4_4_ = (uint)bVar73 * auVar87._4_4_ | (uint)!bVar73 * -0x800000;
            bVar73 = (bool)((byte)(uVar74 >> 2) & 1);
            auVar135._8_4_ = (uint)bVar73 * auVar87._8_4_ | (uint)!bVar73 * -0x800000;
            bVar73 = (bool)((byte)(uVar74 >> 3) & 1);
            auVar135._12_4_ = (uint)bVar73 * auVar87._12_4_ | (uint)!bVar73 * -0x800000;
            bVar73 = (bool)((byte)(uVar74 >> 4) & 1);
            auVar135._16_4_ = (uint)bVar73 * auVar87._16_4_ | (uint)!bVar73 * -0x800000;
            bVar73 = (bool)((byte)(uVar74 >> 5) & 1);
            auVar135._20_4_ = (uint)bVar73 * auVar87._20_4_ | (uint)!bVar73 * -0x800000;
            bVar73 = (bool)((byte)(uVar74 >> 6) & 1);
            auVar135._24_4_ = (uint)bVar73 * auVar87._24_4_ | (uint)!bVar73 * -0x800000;
            bVar73 = SUB81(uVar74 >> 7,0);
            auVar135._28_4_ = (uint)bVar73 * auVar87._28_4_ | (uint)!bVar73 * -0x800000;
            auVar32._8_4_ = 0x36000000;
            auVar32._0_8_ = 0x3600000036000000;
            auVar32._12_4_ = 0x36000000;
            auVar32._16_4_ = 0x36000000;
            auVar32._20_4_ = 0x36000000;
            auVar32._24_4_ = 0x36000000;
            auVar32._28_4_ = 0x36000000;
            auVar87 = vmulps_avx512vl(auVar111,auVar32);
            uVar64 = vcmpps_avx512vl(auVar87,local_820,0xe);
            uVar74 = uVar74 & uVar64;
            bVar65 = (byte)uVar74;
            if (bVar65 != 0) {
              uVar64 = vcmpps_avx512vl(auVar89,ZEXT1632(ZEXT816(0) << 0x40),2);
              auVar254._8_4_ = 0x7f800000;
              auVar254._0_8_ = 0x7f8000007f800000;
              auVar254._12_4_ = 0x7f800000;
              auVar254._16_4_ = 0x7f800000;
              auVar254._20_4_ = 0x7f800000;
              auVar254._24_4_ = 0x7f800000;
              auVar254._28_4_ = 0x7f800000;
              auVar259._8_4_ = 0xff800000;
              auVar259._0_8_ = 0xff800000ff800000;
              auVar259._12_4_ = 0xff800000;
              auVar259._16_4_ = 0xff800000;
              auVar259._20_4_ = 0xff800000;
              auVar259._24_4_ = 0xff800000;
              auVar259._28_4_ = 0xff800000;
              auVar89 = vblendmps_avx512vl(auVar254,auVar259);
              bVar70 = (byte)uVar64;
              uVar68 = (uint)(bVar70 & 1) * auVar89._0_4_ |
                       (uint)!(bool)(bVar70 & 1) * auVar87._0_4_;
              bVar73 = (bool)((byte)(uVar64 >> 1) & 1);
              uVar63 = (uint)bVar73 * auVar89._4_4_ | (uint)!bVar73 * auVar87._4_4_;
              bVar73 = (bool)((byte)(uVar64 >> 2) & 1);
              uVar144 = (uint)bVar73 * auVar89._8_4_ | (uint)!bVar73 * auVar87._8_4_;
              bVar73 = (bool)((byte)(uVar64 >> 3) & 1);
              uVar145 = (uint)bVar73 * auVar89._12_4_ | (uint)!bVar73 * auVar87._12_4_;
              bVar73 = (bool)((byte)(uVar64 >> 4) & 1);
              uVar146 = (uint)bVar73 * auVar89._16_4_ | (uint)!bVar73 * auVar87._16_4_;
              bVar73 = (bool)((byte)(uVar64 >> 5) & 1);
              uVar147 = (uint)bVar73 * auVar89._20_4_ | (uint)!bVar73 * auVar87._20_4_;
              bVar73 = (bool)((byte)(uVar64 >> 6) & 1);
              uVar148 = (uint)bVar73 * auVar89._24_4_ | (uint)!bVar73 * auVar87._24_4_;
              bVar73 = SUB81(uVar64 >> 7,0);
              uVar149 = (uint)bVar73 * auVar89._28_4_ | (uint)!bVar73 * auVar87._28_4_;
              auVar134._0_4_ = (bVar65 & 1) * uVar68 | !(bool)(bVar65 & 1) * auVar134._0_4_;
              bVar73 = (bool)((byte)(uVar74 >> 1) & 1);
              auVar134._4_4_ = bVar73 * uVar63 | !bVar73 * auVar134._4_4_;
              bVar73 = (bool)((byte)(uVar74 >> 2) & 1);
              auVar134._8_4_ = bVar73 * uVar144 | !bVar73 * auVar134._8_4_;
              bVar73 = (bool)((byte)(uVar74 >> 3) & 1);
              auVar134._12_4_ = bVar73 * uVar145 | !bVar73 * auVar134._12_4_;
              bVar73 = (bool)((byte)(uVar74 >> 4) & 1);
              auVar134._16_4_ = bVar73 * uVar146 | !bVar73 * auVar134._16_4_;
              bVar73 = (bool)((byte)(uVar74 >> 5) & 1);
              auVar134._20_4_ = bVar73 * uVar147 | !bVar73 * auVar134._20_4_;
              bVar73 = (bool)((byte)(uVar74 >> 6) & 1);
              auVar134._24_4_ = bVar73 * uVar148 | !bVar73 * auVar134._24_4_;
              bVar73 = SUB81(uVar74 >> 7,0);
              auVar134._28_4_ = bVar73 * uVar149 | !bVar73 * auVar134._28_4_;
              auVar89 = vblendmps_avx512vl(auVar259,auVar254);
              bVar73 = (bool)((byte)(uVar64 >> 1) & 1);
              bVar10 = (bool)((byte)(uVar64 >> 2) & 1);
              bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
              bVar14 = (bool)((byte)(uVar64 >> 4) & 1);
              bVar11 = (bool)((byte)(uVar64 >> 5) & 1);
              bVar13 = (bool)((byte)(uVar64 >> 6) & 1);
              bVar15 = SUB81(uVar64 >> 7,0);
              auVar135._0_4_ =
                   (uint)(bVar65 & 1) *
                   ((uint)(bVar70 & 1) * auVar89._0_4_ | !(bool)(bVar70 & 1) * uVar68) |
                   !(bool)(bVar65 & 1) * auVar135._0_4_;
              bVar9 = (bool)((byte)(uVar74 >> 1) & 1);
              auVar135._4_4_ =
                   (uint)bVar9 * ((uint)bVar73 * auVar89._4_4_ | !bVar73 * uVar63) |
                   !bVar9 * auVar135._4_4_;
              bVar73 = (bool)((byte)(uVar74 >> 2) & 1);
              auVar135._8_4_ =
                   (uint)bVar73 * ((uint)bVar10 * auVar89._8_4_ | !bVar10 * uVar144) |
                   !bVar73 * auVar135._8_4_;
              bVar73 = (bool)((byte)(uVar74 >> 3) & 1);
              auVar135._12_4_ =
                   (uint)bVar73 * ((uint)bVar12 * auVar89._12_4_ | !bVar12 * uVar145) |
                   !bVar73 * auVar135._12_4_;
              bVar73 = (bool)((byte)(uVar74 >> 4) & 1);
              auVar135._16_4_ =
                   (uint)bVar73 * ((uint)bVar14 * auVar89._16_4_ | !bVar14 * uVar146) |
                   !bVar73 * auVar135._16_4_;
              bVar73 = (bool)((byte)(uVar74 >> 5) & 1);
              auVar135._20_4_ =
                   (uint)bVar73 * ((uint)bVar11 * auVar89._20_4_ | !bVar11 * uVar147) |
                   !bVar73 * auVar135._20_4_;
              bVar73 = (bool)((byte)(uVar74 >> 6) & 1);
              auVar135._24_4_ =
                   (uint)bVar73 * ((uint)bVar13 * auVar89._24_4_ | !bVar13 * uVar148) |
                   !bVar73 * auVar135._24_4_;
              bVar73 = SUB81(uVar74 >> 7,0);
              auVar135._28_4_ =
                   (uint)bVar73 * ((uint)bVar15 * auVar89._28_4_ | !bVar15 * uVar149) |
                   !bVar73 * auVar135._28_4_;
              bVar61 = (~bVar65 | bVar70) & bVar61;
            }
          }
          auVar267._0_4_ = local_620._0_4_ * auVar183._0_4_;
          auVar267._4_4_ = local_620._4_4_ * auVar183._4_4_;
          auVar267._8_4_ = local_620._8_4_ * auVar183._8_4_;
          auVar267._12_4_ = local_620._12_4_ * auVar183._12_4_;
          auVar267._16_4_ = local_620._16_4_ * auVar183._16_4_;
          auVar267._20_4_ = local_620._20_4_ * auVar183._20_4_;
          auVar267._28_36_ = auVar183._28_36_;
          auVar267._24_4_ = local_620._24_4_ * auVar183._24_4_;
          auVar260 = ZEXT3264(local_600);
          auVar78 = vfmadd231ps_fma(auVar267._0_32_,local_600,auVar101);
          auVar255 = ZEXT3264(local_5e0);
          auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),local_5e0,auVar88);
          auVar245._8_4_ = 0x7fffffff;
          auVar245._0_8_ = 0x7fffffff7fffffff;
          auVar245._12_4_ = 0x7fffffff;
          auVar245._16_4_ = 0x7fffffff;
          auVar245._20_4_ = 0x7fffffff;
          auVar245._24_4_ = 0x7fffffff;
          auVar245._28_4_ = 0x7fffffff;
          auVar89 = vandps_avx(ZEXT1632(auVar78),auVar245);
          auVar267 = ZEXT3264(_local_840);
          _local_1c0 = _local_840;
          auVar243._8_4_ = 0x3e99999a;
          auVar243._0_8_ = 0x3e99999a3e99999a;
          auVar243._12_4_ = 0x3e99999a;
          auVar243._16_4_ = 0x3e99999a;
          auVar243._20_4_ = 0x3e99999a;
          auVar243._24_4_ = 0x3e99999a;
          auVar243._28_4_ = 0x3e99999a;
          uVar18 = vcmpps_avx512vl(auVar89,auVar243,1);
          local_5c0._0_2_ = (short)uVar18;
          local_3c0 = vmaxps_avx(_local_840,auVar135);
          auVar89 = vminps_avx(local_3a0,auVar134);
          uVar18 = vcmpps_avx512vl(_local_840,auVar89,2);
          bVar65 = (byte)uVar18 & bVar59;
          uVar19 = vcmpps_avx512vl(local_3c0,local_3a0,2);
          if ((bVar59 & ((byte)uVar19 | (byte)uVar18)) != 0) {
            auVar52._4_4_ = local_620._4_4_ * auVar266._4_4_;
            auVar52._0_4_ = local_620._0_4_ * auVar266._0_4_;
            auVar52._8_4_ = local_620._8_4_ * auVar266._8_4_;
            auVar52._12_4_ = local_620._12_4_ * auVar266._12_4_;
            auVar52._16_4_ = local_620._16_4_ * auVar266._16_4_;
            auVar52._20_4_ = local_620._20_4_ * auVar266._20_4_;
            auVar52._24_4_ = local_620._24_4_ * auVar266._24_4_;
            auVar52._28_4_ = auVar89._28_4_;
            auVar78 = vfmadd213ps_fma(auVar104,local_600,auVar52);
            auVar78 = vfmadd213ps_fma(auVar100,local_5e0,ZEXT1632(auVar78));
            auVar89 = vandps_avx(ZEXT1632(auVar78),auVar245);
            uVar18 = vcmpps_avx512vl(auVar89,auVar243,1);
            bVar70 = (byte)uVar18 | ~bVar61;
            auVar162._8_4_ = 2;
            auVar162._0_8_ = 0x200000002;
            auVar162._12_4_ = 2;
            auVar162._16_4_ = 2;
            auVar162._20_4_ = 2;
            auVar162._24_4_ = 2;
            auVar162._28_4_ = 2;
            auVar33._8_4_ = 3;
            auVar33._0_8_ = 0x300000003;
            auVar33._12_4_ = 3;
            auVar33._16_4_ = 3;
            auVar33._20_4_ = 3;
            auVar33._24_4_ = 3;
            auVar33._28_4_ = 3;
            auVar89 = vpblendmd_avx512vl(auVar162,auVar33);
            local_360._0_4_ = (uint)(bVar70 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar70 & 1) * 2;
            bVar73 = (bool)(bVar70 >> 1 & 1);
            local_360._4_4_ = (uint)bVar73 * auVar89._4_4_ | (uint)!bVar73 * 2;
            bVar73 = (bool)(bVar70 >> 2 & 1);
            local_360._8_4_ = (uint)bVar73 * auVar89._8_4_ | (uint)!bVar73 * 2;
            bVar73 = (bool)(bVar70 >> 3 & 1);
            local_360._12_4_ = (uint)bVar73 * auVar89._12_4_ | (uint)!bVar73 * 2;
            bVar73 = (bool)(bVar70 >> 4 & 1);
            local_360._16_4_ = (uint)bVar73 * auVar89._16_4_ | (uint)!bVar73 * 2;
            bVar73 = (bool)(bVar70 >> 5 & 1);
            local_360._20_4_ = (uint)bVar73 * auVar89._20_4_ | (uint)!bVar73 * 2;
            bVar73 = (bool)(bVar70 >> 6 & 1);
            local_360._24_4_ = (uint)bVar73 * auVar89._24_4_ | (uint)!bVar73 * 2;
            local_360._28_4_ = (uint)(bVar70 >> 7) * auVar89._28_4_ | (uint)!(bool)(bVar70 >> 7) * 2
            ;
            local_540 = vpbroadcastd_avx512vl();
            uVar18 = vpcmpd_avx512vl(local_540,local_360,5);
            bVar70 = (byte)uVar18 & bVar65;
            auVar139._16_16_ = auVar99._16_16_;
            if (bVar70 == 0) {
              auVar164._4_4_ = uVar75;
              auVar164._0_4_ = uVar75;
              auVar164._8_4_ = uVar75;
              auVar164._12_4_ = uVar75;
              auVar164._16_4_ = uVar75;
              auVar164._20_4_ = uVar75;
              auVar164._24_4_ = uVar75;
              auVar164._28_4_ = uVar75;
              auVar89 = local_3c0;
            }
            else {
              local_380 = local_3c0;
              auVar86 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
              auVar78 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
              auVar85 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
              auVar2 = vminps_avx(auVar86,auVar85);
              auVar86 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
              auVar85 = vmaxps_avx(auVar78,auVar86);
              auVar186._8_4_ = 0x7fffffff;
              auVar186._0_8_ = 0x7fffffff7fffffff;
              auVar186._12_4_ = 0x7fffffff;
              auVar78 = vandps_avx(auVar2,auVar186);
              auVar86 = vandps_avx(auVar85,auVar186);
              auVar78 = vmaxps_avx(auVar78,auVar86);
              auVar86 = vmovshdup_avx(auVar78);
              auVar86 = vmaxss_avx(auVar86,auVar78);
              auVar78 = vshufpd_avx(auVar78,auVar78,1);
              auVar78 = vmaxss_avx(auVar78,auVar86);
              fVar233 = auVar78._0_4_ * 1.9073486e-06;
              local_6e0 = vshufps_avx(auVar85,auVar85,0xff);
              local_5a0 = (float)local_840._0_4_ + fVar150;
              fStack_59c = (float)local_840._4_4_ + fVar150;
              fStack_598 = fStack_838 + fVar150;
              fStack_594 = fStack_834 + fVar150;
              fStack_590 = fStack_830 + fVar150;
              fStack_58c = fStack_82c + fVar150;
              fStack_588 = fStack_828 + fVar150;
              fStack_584 = fStack_824 + fVar150;
              do {
                auVar163._8_4_ = 0x7f800000;
                auVar163._0_8_ = 0x7f8000007f800000;
                auVar163._12_4_ = 0x7f800000;
                auVar163._16_4_ = 0x7f800000;
                auVar163._20_4_ = 0x7f800000;
                auVar163._24_4_ = 0x7f800000;
                auVar163._28_4_ = 0x7f800000;
                auVar89 = vblendmps_avx512vl(auVar163,_local_840);
                auVar137._0_4_ =
                     (uint)(bVar70 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar70 & 1) * 0x7f800000;
                bVar73 = (bool)(bVar70 >> 1 & 1);
                auVar137._4_4_ = (uint)bVar73 * auVar89._4_4_ | (uint)!bVar73 * 0x7f800000;
                bVar73 = (bool)(bVar70 >> 2 & 1);
                auVar137._8_4_ = (uint)bVar73 * auVar89._8_4_ | (uint)!bVar73 * 0x7f800000;
                bVar73 = (bool)(bVar70 >> 3 & 1);
                auVar137._12_4_ = (uint)bVar73 * auVar89._12_4_ | (uint)!bVar73 * 0x7f800000;
                bVar73 = (bool)(bVar70 >> 4 & 1);
                auVar137._16_4_ = (uint)bVar73 * auVar89._16_4_ | (uint)!bVar73 * 0x7f800000;
                bVar73 = (bool)(bVar70 >> 5 & 1);
                auVar137._20_4_ = (uint)bVar73 * auVar89._20_4_ | (uint)!bVar73 * 0x7f800000;
                auVar137._24_4_ =
                     (uint)(bVar70 >> 6) * auVar89._24_4_ | (uint)!(bool)(bVar70 >> 6) * 0x7f800000;
                auVar137._28_4_ = 0x7f800000;
                auVar89 = vshufps_avx(auVar137,auVar137,0xb1);
                auVar89 = vminps_avx(auVar137,auVar89);
                auVar100 = vshufpd_avx(auVar89,auVar89,5);
                auVar89 = vminps_avx(auVar89,auVar100);
                auVar100 = vpermpd_avx2(auVar89,0x4e);
                auVar89 = vminps_avx(auVar89,auVar100);
                uVar18 = vcmpps_avx512vl(auVar137,auVar89,0);
                bVar60 = (byte)uVar18 & bVar70;
                bVar62 = bVar70;
                if (bVar60 != 0) {
                  bVar62 = bVar60;
                }
                iVar21 = 0;
                for (uVar75 = (uint)bVar62; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x80000000) {
                  iVar21 = iVar21 + 1;
                }
                uVar75 = *(uint *)(local_1e0 + (uint)(iVar21 << 2));
                uVar68 = *(uint *)(local_1c0 + (uint)(iVar21 << 2));
                fVar212 = auVar17._0_4_;
                if ((float)local_7e0._0_4_ < 0.0) {
                  fVar212 = sqrtf((float)local_7e0._0_4_);
                }
                auVar78 = vinsertps_avx(ZEXT416(uVar68),ZEXT416(uVar75),0x10);
                bVar73 = true;
                uVar74 = 0;
                do {
                  uVar166 = auVar78._0_4_;
                  auVar151._4_4_ = uVar166;
                  auVar151._0_4_ = uVar166;
                  auVar151._8_4_ = uVar166;
                  auVar151._12_4_ = uVar166;
                  auVar86 = vfmadd132ps_fma(auVar151,ZEXT816(0) << 0x40,local_7d0);
                  auVar85 = vmovshdup_avx(auVar78);
                  fVar246 = auVar85._0_4_;
                  fVar210 = 1.0 - fVar246;
                  fVar228 = fVar246 * fVar246;
                  auVar81 = SUB6416(ZEXT464(0x40400000),0);
                  auVar80 = SUB6416(ZEXT464(0xc0a00000),0);
                  auVar77 = vfmadd213ss_fma(auVar81,auVar85,auVar80);
                  auVar2 = vfmadd213ss_fma(auVar77,ZEXT416((uint)fVar228),
                                           SUB6416(ZEXT464(0x40000000),0));
                  auVar79 = vfmadd213ss_fma(auVar81,ZEXT416((uint)fVar210),auVar80);
                  auVar79 = vfmadd213ss_fma(auVar79,ZEXT416((uint)(fVar210 * fVar210)),
                                            SUB6416(ZEXT464(0x40000000),0));
                  fVar229 = fVar210 * fVar210 * -fVar246 * 0.5;
                  fVar230 = auVar2._0_4_ * 0.5;
                  fVar231 = auVar79._0_4_ * 0.5;
                  fVar232 = fVar246 * fVar246 * -fVar210 * 0.5;
                  auVar214._0_4_ = fVar232 * (float)local_7c0._0_4_;
                  auVar214._4_4_ = fVar232 * (float)local_7c0._4_4_;
                  auVar214._8_4_ = fVar232 * fStack_7b8;
                  auVar214._12_4_ = fVar232 * fStack_7b4;
                  auVar234._4_4_ = fVar231;
                  auVar234._0_4_ = fVar231;
                  auVar234._8_4_ = fVar231;
                  auVar234._12_4_ = fVar231;
                  auVar2 = vfmadd132ps_fma(auVar234,auVar214,local_780._0_16_);
                  auVar187._4_4_ = fVar230;
                  auVar187._0_4_ = fVar230;
                  auVar187._8_4_ = fVar230;
                  auVar187._12_4_ = fVar230;
                  auVar2 = vfmadd132ps_fma(auVar187,auVar2,local_7a0._0_16_);
                  auVar215._4_4_ = fVar229;
                  auVar215._0_4_ = fVar229;
                  auVar215._8_4_ = fVar229;
                  auVar215._12_4_ = fVar229;
                  auVar2 = vfmadd132ps_fma(auVar215,auVar2,local_760._0_16_);
                  auVar79 = vfmadd231ss_fma(auVar80,auVar85,ZEXT416(0x41100000));
                  local_660._0_16_ = auVar79;
                  auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar85,
                                            ZEXT416(0x40800000));
                  local_680._0_16_ = auVar79;
                  auVar79 = vfmadd213ss_fma(auVar81,auVar85,ZEXT416(0xbf800000));
                  local_6a0._0_16_ = auVar79;
                  local_640._0_16_ = auVar2;
                  auVar2 = vsubps_avx(auVar86,auVar2);
                  auVar86 = vdpps_avx(auVar2,auVar2,0x7f);
                  fVar229 = auVar86._0_4_;
                  local_740 = ZEXT1632(auVar78);
                  if (fVar229 < 0.0) {
                    local_800._0_4_ = fVar228;
                    local_820._0_4_ = fVar210 * -2.0;
                    auVar273._0_4_ = sqrtf(fVar229);
                    auVar273._4_60_ = extraout_var;
                    auVar77 = ZEXT416(auVar77._0_4_);
                    auVar78 = auVar273._0_16_;
                  }
                  else {
                    auVar78 = vsqrtss_avx(auVar86,auVar86);
                    local_820._0_4_ = fVar210 * -2.0;
                    local_800._0_4_ = fVar228;
                  }
                  auVar81 = vfnmadd231ss_fma(ZEXT416((uint)(fVar246 * (fVar210 + fVar210))),
                                             ZEXT416((uint)fVar210),ZEXT416((uint)fVar210));
                  auVar77 = vfmadd213ss_fma(auVar77,ZEXT416((uint)(fVar246 + fVar246)),
                                            ZEXT416((uint)(fVar246 * fVar246 * 3.0)));
                  auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar85,
                                            SUB6416(ZEXT464(0x40000000),0));
                  auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar210 * fVar210 * -3.0)),
                                            ZEXT416((uint)(fVar210 + fVar210)),auVar79);
                  auVar79 = vfmadd213ss_fma(ZEXT416((uint)local_820._0_4_),auVar85,
                                            ZEXT416((uint)local_800._0_4_));
                  fVar228 = auVar81._0_4_ * 0.5;
                  fVar230 = auVar77._0_4_ * 0.5;
                  fVar231 = auVar80._0_4_ * 0.5;
                  fVar232 = auVar79._0_4_ * 0.5;
                  auVar216._0_4_ = fVar232 * (float)local_7c0._0_4_;
                  auVar216._4_4_ = fVar232 * (float)local_7c0._4_4_;
                  auVar216._8_4_ = fVar232 * fStack_7b8;
                  auVar216._12_4_ = fVar232 * fStack_7b4;
                  auVar188._4_4_ = fVar231;
                  auVar188._0_4_ = fVar231;
                  auVar188._8_4_ = fVar231;
                  auVar188._12_4_ = fVar231;
                  auVar77 = vfmadd132ps_fma(auVar188,auVar216,local_780._0_16_);
                  auVar168._4_4_ = fVar230;
                  auVar168._0_4_ = fVar230;
                  auVar168._8_4_ = fVar230;
                  auVar168._12_4_ = fVar230;
                  auVar77 = vfmadd132ps_fma(auVar168,auVar77,local_7a0._0_16_);
                  auVar268._4_4_ = fVar228;
                  auVar268._0_4_ = fVar228;
                  auVar268._8_4_ = fVar228;
                  auVar268._12_4_ = fVar228;
                  auVar77 = vfmadd132ps_fma(auVar268,auVar77,local_760._0_16_);
                  local_800._0_16_ = vdpps_avx(auVar77,auVar77,0x7f);
                  auVar54._12_4_ = 0;
                  auVar54._0_12_ = ZEXT812(0);
                  fVar228 = local_800._0_4_;
                  auVar79 = vrsqrt14ss_avx512f(auVar54 << 0x20,ZEXT416((uint)fVar228));
                  fVar230 = auVar79._0_4_;
                  local_820._0_16_ = vrcp14ss_avx512f(auVar54 << 0x20,ZEXT416((uint)fVar228));
                  auVar23._8_4_ = 0x80000000;
                  auVar23._0_8_ = 0x8000000080000000;
                  auVar23._12_4_ = 0x80000000;
                  auVar80 = vxorps_avx512vl(local_800._0_16_,auVar23);
                  auVar79 = vfnmadd213ss_fma(local_820._0_16_,local_800._0_16_,
                                             SUB6416(ZEXT464(0x40000000),0));
                  uVar75 = auVar78._0_4_;
                  if (fVar228 < auVar80._0_4_) {
                    fVar231 = sqrtf(fVar228);
                    auVar78 = ZEXT416(uVar75);
                  }
                  else {
                    auVar80 = vsqrtss_avx(local_800._0_16_,local_800._0_16_);
                    fVar231 = auVar80._0_4_;
                  }
                  fVar228 = fVar230 * 1.5 + fVar228 * -0.5 * fVar230 * fVar230 * fVar230;
                  auVar152._0_4_ = auVar77._0_4_ * fVar228;
                  auVar152._4_4_ = auVar77._4_4_ * fVar228;
                  auVar152._8_4_ = auVar77._8_4_ * fVar228;
                  auVar152._12_4_ = auVar77._12_4_ * fVar228;
                  auVar80 = vdpps_avx(auVar2,auVar152,0x7f);
                  fVar210 = auVar78._0_4_;
                  fVar230 = auVar80._0_4_;
                  auVar153._0_4_ = fVar230 * fVar230;
                  auVar153._4_4_ = auVar80._4_4_ * auVar80._4_4_;
                  auVar153._8_4_ = auVar80._8_4_ * auVar80._8_4_;
                  auVar153._12_4_ = auVar80._12_4_ * auVar80._12_4_;
                  auVar81 = vsubps_avx512vl(auVar86,auVar153);
                  fVar232 = auVar81._0_4_;
                  auVar169._4_12_ = ZEXT812(0) << 0x20;
                  auVar169._0_4_ = fVar232;
                  auVar82 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar169);
                  auVar83 = vmulss_avx512f(auVar81,ZEXT416(0xbf000000));
                  if (fVar232 < 0.0) {
                    local_6d0 = fVar228;
                    fStack_6cc = fVar228;
                    fStack_6c8 = fVar228;
                    fStack_6c4 = fVar228;
                    local_6c0 = auVar82;
                    fVar232 = sqrtf(fVar232);
                    auVar83 = ZEXT416(auVar83._0_4_);
                    auVar78 = ZEXT416(uVar75);
                    auVar81 = local_6c0;
                    fVar228 = local_6d0;
                    fVar246 = fStack_6cc;
                    fVar247 = fStack_6c8;
                    fVar248 = fStack_6c4;
                  }
                  else {
                    auVar81 = vsqrtss_avx(auVar81,auVar81);
                    fVar232 = auVar81._0_4_;
                    auVar81 = auVar82;
                    fVar246 = fVar228;
                    fVar247 = fVar228;
                    fVar248 = fVar228;
                  }
                  auVar266 = ZEXT1664(auVar2);
                  auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar273 = ZEXT3264(auVar89);
                  auVar170._0_4_ = (float)local_6a0._0_4_ * (float)local_7c0._0_4_;
                  auVar170._4_4_ = (float)local_6a0._0_4_ * (float)local_7c0._4_4_;
                  auVar170._8_4_ = (float)local_6a0._0_4_ * fStack_7b8;
                  auVar170._12_4_ = (float)local_6a0._0_4_ * fStack_7b4;
                  auVar189._4_4_ = local_680._0_4_;
                  auVar189._0_4_ = local_680._0_4_;
                  auVar189._8_4_ = local_680._0_4_;
                  auVar189._12_4_ = local_680._0_4_;
                  auVar185 = vfmadd132ps_fma(auVar189,auVar170,local_780._0_16_);
                  auVar171._4_4_ = local_660._0_4_;
                  auVar171._0_4_ = local_660._0_4_;
                  auVar171._8_4_ = local_660._0_4_;
                  auVar171._12_4_ = local_660._0_4_;
                  auVar185 = vfmadd132ps_fma(auVar171,auVar185,local_7a0._0_16_);
                  auVar85 = vfmadd213ss_fma(auVar85,SUB6416(ZEXT464(0xc0400000),0),
                                            ZEXT416(0x40000000));
                  uVar166 = auVar85._0_4_;
                  auVar190._4_4_ = uVar166;
                  auVar190._0_4_ = uVar166;
                  auVar190._8_4_ = uVar166;
                  auVar190._12_4_ = uVar166;
                  auVar85 = vfmadd132ps_fma(auVar190,auVar185,local_760._0_16_);
                  auVar172._0_4_ = auVar85._0_4_ * (float)local_800._0_4_;
                  auVar172._4_4_ = auVar85._4_4_ * (float)local_800._0_4_;
                  auVar172._8_4_ = auVar85._8_4_ * (float)local_800._0_4_;
                  auVar172._12_4_ = auVar85._12_4_ * (float)local_800._0_4_;
                  auVar85 = vdpps_avx(auVar77,auVar85,0x7f);
                  fVar184 = auVar85._0_4_;
                  auVar191._0_4_ = auVar77._0_4_ * fVar184;
                  auVar191._4_4_ = auVar77._4_4_ * fVar184;
                  auVar191._8_4_ = auVar77._8_4_ * fVar184;
                  auVar191._12_4_ = auVar77._12_4_ * fVar184;
                  auVar85 = vsubps_avx(auVar172,auVar191);
                  fVar184 = auVar79._0_4_ * (float)local_820._0_4_;
                  auVar185 = vmaxss_avx(ZEXT416((uint)fVar233),
                                        ZEXT416((uint)(local_740._0_4_ * fVar212 * 1.9073486e-06)));
                  auVar24._8_4_ = 0x80000000;
                  auVar24._0_8_ = 0x8000000080000000;
                  auVar24._12_4_ = 0x80000000;
                  auVar84 = vxorps_avx512vl(auVar77,auVar24);
                  auVar192._0_4_ = fVar228 * auVar85._0_4_ * fVar184;
                  auVar192._4_4_ = fVar246 * auVar85._4_4_ * fVar184;
                  auVar192._8_4_ = fVar247 * auVar85._8_4_ * fVar184;
                  auVar192._12_4_ = fVar248 * auVar85._12_4_ * fVar184;
                  auVar267 = ZEXT1664(auVar152);
                  auVar85 = vdpps_avx(auVar84,auVar152,0x7f);
                  auVar79 = vfmadd213ss_fma(auVar78,ZEXT416((uint)fVar233),auVar185);
                  auVar78 = vdpps_avx(auVar2,auVar192,0x7f);
                  auVar213 = vfmadd213ss_fma(ZEXT416((uint)(fVar210 + 1.0)),
                                             ZEXT416((uint)(fVar233 / fVar231)),auVar79);
                  fVar228 = auVar85._0_4_ + auVar78._0_4_;
                  auVar78 = vdpps_avx(local_7d0,auVar152,0x7f);
                  auVar85 = vdpps_avx(auVar2,auVar84,0x7f);
                  auVar79 = vmulss_avx512f(auVar83,auVar81);
                  fVar231 = auVar82._0_4_ * 1.5 + auVar79._0_4_ * auVar81._0_4_ * auVar81._0_4_;
                  auVar79 = vdpps_avx(auVar2,local_7d0,0x7f);
                  auVar82 = vfnmadd231ss_fma(auVar85,auVar80,ZEXT416((uint)fVar228));
                  auVar79 = vfnmadd231ss_fma(auVar79,auVar80,auVar78);
                  auVar85 = vpermilps_avx(local_640._0_16_,0xff);
                  fVar232 = fVar232 - auVar85._0_4_;
                  auVar81 = vshufps_avx(auVar77,auVar77,0xff);
                  auVar85 = vfmsub213ss_fma(auVar82,ZEXT416((uint)fVar231),auVar81);
                  auVar257._8_4_ = 0x80000000;
                  auVar257._0_8_ = 0x8000000080000000;
                  auVar257._12_4_ = 0x80000000;
                  auVar260 = ZEXT1664(auVar257);
                  auVar252._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
                  auVar252._8_4_ = auVar85._8_4_ ^ 0x80000000;
                  auVar252._12_4_ = auVar85._12_4_ ^ 0x80000000;
                  auVar255 = ZEXT1664(auVar252);
                  auVar79 = ZEXT416((uint)(auVar79._0_4_ * fVar231));
                  auVar82 = vfmsub231ss_fma(ZEXT416((uint)(auVar78._0_4_ * auVar85._0_4_)),
                                            ZEXT416((uint)fVar228),auVar79);
                  auVar85 = vinsertps_avx(auVar252,auVar79,0x1c);
                  auVar241._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
                  auVar241._8_4_ = auVar78._8_4_ ^ 0x80000000;
                  auVar241._12_4_ = auVar78._12_4_ ^ 0x80000000;
                  auVar79 = vinsertps_avx(ZEXT416((uint)fVar228),auVar241,0x10);
                  auVar217._0_4_ = auVar82._0_4_;
                  auVar217._4_4_ = auVar217._0_4_;
                  auVar217._8_4_ = auVar217._0_4_;
                  auVar217._12_4_ = auVar217._0_4_;
                  auVar78 = vdivps_avx(auVar85,auVar217);
                  auVar85 = vdivps_avx(auVar79,auVar217);
                  auVar218._0_4_ = fVar230 * auVar78._0_4_ + fVar232 * auVar85._0_4_;
                  auVar218._4_4_ = fVar230 * auVar78._4_4_ + fVar232 * auVar85._4_4_;
                  auVar218._8_4_ = fVar230 * auVar78._8_4_ + fVar232 * auVar85._8_4_;
                  auVar218._12_4_ = fVar230 * auVar78._12_4_ + fVar232 * auVar85._12_4_;
                  auVar78 = vsubps_avx(local_740._0_16_,auVar218);
                  auVar25._8_4_ = 0x7fffffff;
                  auVar25._0_8_ = 0x7fffffff7fffffff;
                  auVar25._12_4_ = 0x7fffffff;
                  auVar85 = vandps_avx512vl(auVar80,auVar25);
                  if (auVar85._0_4_ < auVar213._0_4_) {
                    auVar85 = vfmadd231ss_fma(ZEXT416((uint)(auVar213._0_4_ + auVar185._0_4_)),
                                              local_6e0,ZEXT416(0x36000000));
                    auVar26._8_4_ = 0x7fffffff;
                    auVar26._0_8_ = 0x7fffffff7fffffff;
                    auVar26._12_4_ = 0x7fffffff;
                    auVar79 = vandps_avx512vl(ZEXT416((uint)fVar232),auVar26);
                    if (auVar79._0_4_ < auVar85._0_4_) {
                      fVar212 = auVar78._0_4_ + (float)local_6f0._0_4_;
                      if (fVar212 < fVar211) {
LAB_01e73e31:
                        bVar62 = 0;
                        goto LAB_01e73e54;
                      }
                      fVar228 = *(float *)(ray + k * 4 + 0x100);
                      if (fVar212 <= fVar228) {
                        auVar85 = vmovshdup_avx(auVar78);
                        bVar62 = 0;
                        if ((auVar85._0_4_ < 0.0) || (1.0 < auVar85._0_4_)) goto LAB_01e73e54;
                        auVar219._0_12_ = ZEXT812(0);
                        auVar219._12_4_ = 0;
                        auVar139._0_16_ = auVar219;
                        auVar138._4_28_ = auVar139._4_28_;
                        auVar138._0_4_ = fVar229;
                        auVar85 = vrsqrt14ss_avx512f(auVar219,auVar138._0_16_);
                        fVar229 = auVar85._0_4_;
                        auVar86 = vmulss_avx512f(auVar86,ZEXT416(0xbf000000));
                        pGVar4 = (context->scene->geometries).items[uVar66].ptr;
                        if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) goto LAB_01e73e31;
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (bVar62 = 1, pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0))
                        goto LAB_01e73e54;
                        fVar229 = fVar229 * 1.5 + auVar86._0_4_ * fVar229 * fVar229 * fVar229;
                        auVar193._0_4_ = auVar2._0_4_ * fVar229;
                        auVar193._4_4_ = auVar2._4_4_ * fVar229;
                        auVar193._8_4_ = auVar2._8_4_ * fVar229;
                        auVar193._12_4_ = auVar2._12_4_ * fVar229;
                        auVar79 = vfmadd213ps_fma(auVar81,auVar193,auVar77);
                        auVar86 = vshufps_avx(auVar193,auVar193,0xc9);
                        auVar85 = vshufps_avx(auVar77,auVar77,0xc9);
                        auVar194._0_4_ = auVar193._0_4_ * auVar85._0_4_;
                        auVar194._4_4_ = auVar193._4_4_ * auVar85._4_4_;
                        auVar194._8_4_ = auVar193._8_4_ * auVar85._8_4_;
                        auVar194._12_4_ = auVar193._12_4_ * auVar85._12_4_;
                        auVar77 = vfmsub231ps_fma(auVar194,auVar77,auVar86);
                        auVar86 = vshufps_avx(auVar77,auVar77,0xc9);
                        auVar85 = vshufps_avx(auVar79,auVar79,0xc9);
                        auVar77 = vshufps_avx(auVar77,auVar77,0xd2);
                        auVar154._0_4_ = auVar79._0_4_ * auVar77._0_4_;
                        auVar154._4_4_ = auVar79._4_4_ * auVar77._4_4_;
                        auVar154._8_4_ = auVar79._8_4_ * auVar77._8_4_;
                        auVar154._12_4_ = auVar79._12_4_ * auVar77._12_4_;
                        auVar86 = vfmsub231ps_fma(auVar154,auVar86,auVar85);
                        auVar226._8_4_ = 1;
                        auVar226._0_8_ = 0x100000001;
                        auVar226._12_4_ = 1;
                        auVar226._16_4_ = 1;
                        auVar226._20_4_ = 1;
                        auVar226._24_4_ = 1;
                        auVar226._28_4_ = 1;
                        local_480 = vpermps_avx2(auVar226,ZEXT1632(auVar78));
                        auVar89 = vpermps_avx2(auVar226,ZEXT1632(auVar86));
                        auVar239._8_4_ = 2;
                        auVar239._0_8_ = 0x200000002;
                        auVar239._12_4_ = 2;
                        auVar239._16_4_ = 2;
                        auVar239._20_4_ = 2;
                        auVar239._24_4_ = 2;
                        auVar239._28_4_ = 2;
                        local_4c0 = vpermps_avx2(auVar239,ZEXT1632(auVar86));
                        local_4a0 = auVar86._0_4_;
                        local_4e0[0] = (RTCHitN)auVar89[0];
                        local_4e0[1] = (RTCHitN)auVar89[1];
                        local_4e0[2] = (RTCHitN)auVar89[2];
                        local_4e0[3] = (RTCHitN)auVar89[3];
                        local_4e0[4] = (RTCHitN)auVar89[4];
                        local_4e0[5] = (RTCHitN)auVar89[5];
                        local_4e0[6] = (RTCHitN)auVar89[6];
                        local_4e0[7] = (RTCHitN)auVar89[7];
                        local_4e0[8] = (RTCHitN)auVar89[8];
                        local_4e0[9] = (RTCHitN)auVar89[9];
                        local_4e0[10] = (RTCHitN)auVar89[10];
                        local_4e0[0xb] = (RTCHitN)auVar89[0xb];
                        local_4e0[0xc] = (RTCHitN)auVar89[0xc];
                        local_4e0[0xd] = (RTCHitN)auVar89[0xd];
                        local_4e0[0xe] = (RTCHitN)auVar89[0xe];
                        local_4e0[0xf] = (RTCHitN)auVar89[0xf];
                        local_4e0[0x10] = (RTCHitN)auVar89[0x10];
                        local_4e0[0x11] = (RTCHitN)auVar89[0x11];
                        local_4e0[0x12] = (RTCHitN)auVar89[0x12];
                        local_4e0[0x13] = (RTCHitN)auVar89[0x13];
                        local_4e0[0x14] = (RTCHitN)auVar89[0x14];
                        local_4e0[0x15] = (RTCHitN)auVar89[0x15];
                        local_4e0[0x16] = (RTCHitN)auVar89[0x16];
                        local_4e0[0x17] = (RTCHitN)auVar89[0x17];
                        local_4e0[0x18] = (RTCHitN)auVar89[0x18];
                        local_4e0[0x19] = (RTCHitN)auVar89[0x19];
                        local_4e0[0x1a] = (RTCHitN)auVar89[0x1a];
                        local_4e0[0x1b] = (RTCHitN)auVar89[0x1b];
                        local_4e0[0x1c] = (RTCHitN)auVar89[0x1c];
                        local_4e0[0x1d] = (RTCHitN)auVar89[0x1d];
                        local_4e0[0x1e] = (RTCHitN)auVar89[0x1e];
                        local_4e0[0x1f] = (RTCHitN)auVar89[0x1f];
                        uStack_49c = local_4a0;
                        uStack_498 = local_4a0;
                        uStack_494 = local_4a0;
                        uStack_490 = local_4a0;
                        uStack_48c = local_4a0;
                        uStack_488 = local_4a0;
                        uStack_484 = local_4a0;
                        local_460 = ZEXT432(0) << 0x20;
                        local_440 = local_500._0_8_;
                        uStack_438 = local_500._8_8_;
                        uStack_430 = local_500._16_8_;
                        uStack_428 = local_500._24_8_;
                        local_420 = local_520;
                        vpcmpeqd_avx2(local_520,local_520);
                        local_400 = context->user->instID[0];
                        uStack_3fc = local_400;
                        uStack_3f8 = local_400;
                        uStack_3f4 = local_400;
                        uStack_3f0 = local_400;
                        uStack_3ec = local_400;
                        uStack_3e8 = local_400;
                        uStack_3e4 = local_400;
                        local_3e0 = context->user->instPrimID[0];
                        uStack_3dc = local_3e0;
                        uStack_3d8 = local_3e0;
                        uStack_3d4 = local_3e0;
                        uStack_3d0 = local_3e0;
                        uStack_3cc = local_3e0;
                        uStack_3c8 = local_3e0;
                        uStack_3c4 = local_3e0;
                        *(float *)(ray + k * 4 + 0x100) = fVar212;
                        local_720 = local_560;
                        local_870.valid = (int *)local_720;
                        local_870.geometryUserPtr = pGVar4->userPtr;
                        local_870.context = context->user;
                        local_870.hit = local_4e0;
                        local_870.N = 8;
                        local_870.ray = (RTCRayN *)ray;
                        if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar255 = ZEXT1664(auVar252);
                          auVar260 = ZEXT1664(auVar257);
                          auVar266 = ZEXT1664(auVar2);
                          auVar267 = ZEXT1664(auVar152);
                          (*pGVar4->occlusionFilterN)(&local_870);
                          auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar273 = ZEXT3264(auVar89);
                        }
                        if (local_720 != (undefined1  [32])0x0) {
                          p_Var8 = context->args->filter;
                          if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar255 = ZEXT1664(auVar255._0_16_);
                            auVar260 = ZEXT1664(auVar260._0_16_);
                            auVar266 = ZEXT1664(auVar266._0_16_);
                            auVar267 = ZEXT1664(auVar267._0_16_);
                            (*p_Var8)(&local_870);
                            auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar273 = ZEXT3264(auVar89);
                          }
                          uVar74 = vptestmd_avx512vl(local_720,local_720);
                          auVar89 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar9 = (bool)((byte)uVar74 & 1);
                          bVar10 = (bool)((byte)(uVar74 >> 1) & 1);
                          bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar74 >> 3) & 1);
                          bVar11 = (bool)((byte)(uVar74 >> 4) & 1);
                          bVar13 = (bool)((byte)(uVar74 >> 5) & 1);
                          bVar15 = (bool)((byte)(uVar74 >> 6) & 1);
                          bVar16 = SUB81(uVar74 >> 7,0);
                          *(uint *)(local_870.ray + 0x100) =
                               (uint)bVar9 * auVar89._0_4_ |
                               (uint)!bVar9 * *(int *)(local_870.ray + 0x100);
                          *(uint *)(local_870.ray + 0x104) =
                               (uint)bVar10 * auVar89._4_4_ |
                               (uint)!bVar10 * *(int *)(local_870.ray + 0x104);
                          *(uint *)(local_870.ray + 0x108) =
                               (uint)bVar12 * auVar89._8_4_ |
                               (uint)!bVar12 * *(int *)(local_870.ray + 0x108);
                          *(uint *)(local_870.ray + 0x10c) =
                               (uint)bVar14 * auVar89._12_4_ |
                               (uint)!bVar14 * *(int *)(local_870.ray + 0x10c);
                          *(uint *)(local_870.ray + 0x110) =
                               (uint)bVar11 * auVar89._16_4_ |
                               (uint)!bVar11 * *(int *)(local_870.ray + 0x110);
                          *(uint *)(local_870.ray + 0x114) =
                               (uint)bVar13 * auVar89._20_4_ |
                               (uint)!bVar13 * *(int *)(local_870.ray + 0x114);
                          *(uint *)(local_870.ray + 0x118) =
                               (uint)bVar15 * auVar89._24_4_ |
                               (uint)!bVar15 * *(int *)(local_870.ray + 0x118);
                          *(uint *)(local_870.ray + 0x11c) =
                               (uint)bVar16 * auVar89._28_4_ |
                               (uint)!bVar16 * *(int *)(local_870.ray + 0x11c);
                          bVar62 = 1;
                          if (local_720 != (undefined1  [32])0x0) goto LAB_01e73e54;
                        }
                        *(float *)(ray + k * 4 + 0x100) = fVar228;
                      }
                      bVar62 = 0;
                      goto LAB_01e73e54;
                    }
                  }
                  bVar73 = uVar74 < 4;
                  uVar74 = uVar74 + 1;
                } while (uVar74 != 5);
                bVar73 = false;
                bVar62 = 5;
LAB_01e73e54:
                bVar72 = (bool)(bVar72 | bVar73 & bVar62);
                uVar166 = *(undefined4 *)(ray + k * 4 + 0x100);
                auVar164._4_4_ = uVar166;
                auVar164._0_4_ = uVar166;
                auVar164._8_4_ = uVar166;
                auVar164._12_4_ = uVar166;
                auVar164._16_4_ = uVar166;
                auVar164._20_4_ = uVar166;
                auVar164._24_4_ = uVar166;
                auVar164._28_4_ = uVar166;
                auVar56._4_4_ = fStack_59c;
                auVar56._0_4_ = local_5a0;
                auVar56._8_4_ = fStack_598;
                auVar56._12_4_ = fStack_594;
                auVar56._16_4_ = fStack_590;
                auVar56._20_4_ = fStack_58c;
                auVar56._24_4_ = fStack_588;
                auVar56._28_4_ = fStack_584;
                uVar18 = vcmpps_avx512vl(auVar164,auVar56,0xd);
                bVar70 = ~('\x01' << ((byte)iVar21 & 0x1f)) & bVar70 & (byte)uVar18;
                auVar89 = local_380;
              } while (bVar70 != 0);
            }
            auVar183 = ZEXT3264(local_3c0);
            bVar61 = local_5c0[0] | ~bVar61;
            auVar181._0_4_ = fVar150 + auVar89._0_4_;
            auVar181._4_4_ = fVar150 + auVar89._4_4_;
            auVar181._8_4_ = fVar150 + auVar89._8_4_;
            auVar181._12_4_ = fVar150 + auVar89._12_4_;
            auVar181._16_4_ = fVar150 + auVar89._16_4_;
            auVar181._20_4_ = fVar150 + auVar89._20_4_;
            auVar181._24_4_ = fVar150 + auVar89._24_4_;
            auVar181._28_4_ = fVar150 + auVar89._28_4_;
            uVar18 = vcmpps_avx512vl(auVar181,auVar164,2);
            bVar59 = (byte)uVar19 & bVar59 & (byte)uVar18;
            auVar182._8_4_ = 2;
            auVar182._0_8_ = 0x200000002;
            auVar182._12_4_ = 2;
            auVar182._16_4_ = 2;
            auVar182._20_4_ = 2;
            auVar182._24_4_ = 2;
            auVar182._28_4_ = 2;
            auVar34._8_4_ = 3;
            auVar34._0_8_ = 0x300000003;
            auVar34._12_4_ = 3;
            auVar34._16_4_ = 3;
            auVar34._20_4_ = 3;
            auVar34._24_4_ = 3;
            auVar34._28_4_ = 3;
            auVar89 = vpblendmd_avx512vl(auVar182,auVar34);
            auVar140._0_4_ = (uint)(bVar61 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar61 & 1) * 2;
            bVar73 = (bool)(bVar61 >> 1 & 1);
            auVar140._4_4_ = (uint)bVar73 * auVar89._4_4_ | (uint)!bVar73 * 2;
            bVar73 = (bool)(bVar61 >> 2 & 1);
            auVar140._8_4_ = (uint)bVar73 * auVar89._8_4_ | (uint)!bVar73 * 2;
            bVar73 = (bool)(bVar61 >> 3 & 1);
            auVar140._12_4_ = (uint)bVar73 * auVar89._12_4_ | (uint)!bVar73 * 2;
            bVar73 = (bool)(bVar61 >> 4 & 1);
            auVar140._16_4_ = (uint)bVar73 * auVar89._16_4_ | (uint)!bVar73 * 2;
            bVar73 = (bool)(bVar61 >> 5 & 1);
            auVar140._20_4_ = (uint)bVar73 * auVar89._20_4_ | (uint)!bVar73 * 2;
            bVar73 = (bool)(bVar61 >> 6 & 1);
            auVar140._24_4_ = (uint)bVar73 * auVar89._24_4_ | (uint)!bVar73 * 2;
            auVar140._28_4_ = (uint)(bVar61 >> 7) * auVar89._28_4_ | (uint)!(bool)(bVar61 >> 7) * 2;
            uVar18 = vpcmpd_avx512vl(local_540,auVar140,5);
            bVar61 = (byte)uVar18 & bVar59;
            if (bVar61 != 0) {
              auVar86 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
              auVar78 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
              auVar85 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
              auVar2 = vminps_avx(auVar86,auVar85);
              auVar86 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
              auVar85 = vmaxps_avx(auVar78,auVar86);
              auVar195._8_4_ = 0x7fffffff;
              auVar195._0_8_ = 0x7fffffff7fffffff;
              auVar195._12_4_ = 0x7fffffff;
              auVar78 = vandps_avx(auVar2,auVar195);
              auVar86 = vandps_avx(auVar85,auVar195);
              auVar78 = vmaxps_avx(auVar78,auVar86);
              auVar86 = vmovshdup_avx(auVar78);
              auVar86 = vmaxss_avx(auVar86,auVar78);
              auVar78 = vshufpd_avx(auVar78,auVar78,1);
              auVar78 = vmaxss_avx(auVar78,auVar86);
              fVar233 = auVar78._0_4_ * 1.9073486e-06;
              local_6e0 = vshufps_avx(auVar85,auVar85,0xff);
              local_5a0 = fVar150 + local_3c0._0_4_;
              fStack_59c = fVar150 + local_3c0._4_4_;
              fStack_598 = fVar150 + local_3c0._8_4_;
              fStack_594 = fVar150 + local_3c0._12_4_;
              fStack_590 = fVar150 + local_3c0._16_4_;
              fStack_58c = fVar150 + local_3c0._20_4_;
              fStack_588 = fVar150 + local_3c0._24_4_;
              fStack_584 = fVar150 + local_3c0._28_4_;
              _local_840 = local_3c0;
              local_5c0 = auVar140;
              do {
                auVar165._8_4_ = 0x7f800000;
                auVar165._0_8_ = 0x7f8000007f800000;
                auVar165._12_4_ = 0x7f800000;
                auVar165._16_4_ = 0x7f800000;
                auVar165._20_4_ = 0x7f800000;
                auVar165._24_4_ = 0x7f800000;
                auVar165._28_4_ = 0x7f800000;
                auVar89 = vblendmps_avx512vl(auVar165,auVar183._0_32_);
                auVar141._0_4_ =
                     (uint)(bVar61 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar61 & 1) * 0x7f800000;
                bVar73 = (bool)(bVar61 >> 1 & 1);
                auVar141._4_4_ = (uint)bVar73 * auVar89._4_4_ | (uint)!bVar73 * 0x7f800000;
                bVar73 = (bool)(bVar61 >> 2 & 1);
                auVar141._8_4_ = (uint)bVar73 * auVar89._8_4_ | (uint)!bVar73 * 0x7f800000;
                bVar73 = (bool)(bVar61 >> 3 & 1);
                auVar141._12_4_ = (uint)bVar73 * auVar89._12_4_ | (uint)!bVar73 * 0x7f800000;
                bVar73 = (bool)(bVar61 >> 4 & 1);
                auVar141._16_4_ = (uint)bVar73 * auVar89._16_4_ | (uint)!bVar73 * 0x7f800000;
                bVar73 = (bool)(bVar61 >> 5 & 1);
                auVar141._20_4_ = (uint)bVar73 * auVar89._20_4_ | (uint)!bVar73 * 0x7f800000;
                auVar141._24_4_ =
                     (uint)(bVar61 >> 6) * auVar89._24_4_ | (uint)!(bool)(bVar61 >> 6) * 0x7f800000;
                auVar141._28_4_ = 0x7f800000;
                auVar89 = vshufps_avx(auVar141,auVar141,0xb1);
                auVar89 = vminps_avx(auVar141,auVar89);
                auVar100 = vshufpd_avx(auVar89,auVar89,5);
                auVar89 = vminps_avx(auVar89,auVar100);
                auVar100 = vpermpd_avx2(auVar89,0x4e);
                auVar89 = vminps_avx(auVar89,auVar100);
                uVar18 = vcmpps_avx512vl(auVar141,auVar89,0);
                bVar62 = (byte)uVar18 & bVar61;
                bVar70 = bVar61;
                if (bVar62 != 0) {
                  bVar70 = bVar62;
                }
                iVar21 = 0;
                for (uVar75 = (uint)bVar70; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x80000000) {
                  iVar21 = iVar21 + 1;
                }
                uVar75 = *(uint *)(local_200 + (uint)(iVar21 << 2));
                uVar68 = *(uint *)(local_3a0 + (uint)(iVar21 << 2));
                fVar212 = auVar76._0_4_;
                if ((float)local_7e0._0_4_ < 0.0) {
                  fVar212 = sqrtf((float)local_7e0._0_4_);
                }
                auVar78 = vinsertps_avx(ZEXT416(uVar68),ZEXT416(uVar75),0x10);
                bVar73 = true;
                uVar74 = 0;
                do {
                  uVar166 = auVar78._0_4_;
                  auVar155._4_4_ = uVar166;
                  auVar155._0_4_ = uVar166;
                  auVar155._8_4_ = uVar166;
                  auVar155._12_4_ = uVar166;
                  auVar86 = vfmadd132ps_fma(auVar155,ZEXT816(0) << 0x40,local_7d0);
                  auVar85 = vmovshdup_avx(auVar78);
                  fVar246 = auVar85._0_4_;
                  fVar210 = 1.0 - fVar246;
                  fVar228 = fVar246 * fVar246;
                  auVar81 = SUB6416(ZEXT464(0x40400000),0);
                  auVar80 = SUB6416(ZEXT464(0xc0a00000),0);
                  auVar77 = vfmadd213ss_fma(auVar81,auVar85,auVar80);
                  auVar2 = vfmadd213ss_fma(auVar77,ZEXT416((uint)fVar228),
                                           SUB6416(ZEXT464(0x40000000),0));
                  auVar79 = vfmadd213ss_fma(auVar81,ZEXT416((uint)fVar210),auVar80);
                  auVar79 = vfmadd213ss_fma(auVar79,ZEXT416((uint)(fVar210 * fVar210)),
                                            SUB6416(ZEXT464(0x40000000),0));
                  fVar229 = fVar210 * fVar210 * -fVar246 * 0.5;
                  fVar230 = auVar2._0_4_ * 0.5;
                  fVar231 = auVar79._0_4_ * 0.5;
                  fVar232 = fVar246 * fVar246 * -fVar210 * 0.5;
                  auVar220._0_4_ = fVar232 * (float)local_7c0._0_4_;
                  auVar220._4_4_ = fVar232 * (float)local_7c0._4_4_;
                  auVar220._8_4_ = fVar232 * fStack_7b8;
                  auVar220._12_4_ = fVar232 * fStack_7b4;
                  auVar235._4_4_ = fVar231;
                  auVar235._0_4_ = fVar231;
                  auVar235._8_4_ = fVar231;
                  auVar235._12_4_ = fVar231;
                  auVar2 = vfmadd132ps_fma(auVar235,auVar220,local_780._0_16_);
                  auVar196._4_4_ = fVar230;
                  auVar196._0_4_ = fVar230;
                  auVar196._8_4_ = fVar230;
                  auVar196._12_4_ = fVar230;
                  auVar2 = vfmadd132ps_fma(auVar196,auVar2,local_7a0._0_16_);
                  auVar221._4_4_ = fVar229;
                  auVar221._0_4_ = fVar229;
                  auVar221._8_4_ = fVar229;
                  auVar221._12_4_ = fVar229;
                  auVar2 = vfmadd132ps_fma(auVar221,auVar2,local_760._0_16_);
                  auVar79 = vfmadd231ss_fma(auVar80,auVar85,ZEXT416(0x41100000));
                  local_660._0_16_ = auVar79;
                  auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar85,
                                            ZEXT416(0x40800000));
                  local_680._0_16_ = auVar79;
                  auVar79 = vfmadd213ss_fma(auVar81,auVar85,ZEXT416(0xbf800000));
                  local_6a0._0_16_ = auVar79;
                  local_640._0_16_ = auVar2;
                  auVar2 = vsubps_avx(auVar86,auVar2);
                  auVar86 = vdpps_avx(auVar2,auVar2,0x7f);
                  fVar229 = auVar86._0_4_;
                  local_740 = ZEXT1632(auVar78);
                  if (fVar229 < 0.0) {
                    local_800._0_4_ = fVar228;
                    local_820._0_4_ = fVar210 * -2.0;
                    auVar260._0_4_ = sqrtf(fVar229);
                    auVar260._4_60_ = extraout_var_00;
                    auVar77 = ZEXT416(auVar77._0_4_);
                    auVar78 = auVar260._0_16_;
                  }
                  else {
                    auVar78 = vsqrtss_avx(auVar86,auVar86);
                    local_820._0_4_ = fVar210 * -2.0;
                    local_800._0_4_ = fVar228;
                  }
                  auVar81 = vfnmadd231ss_fma(ZEXT416((uint)(fVar246 * (fVar210 + fVar210))),
                                             ZEXT416((uint)fVar210),ZEXT416((uint)fVar210));
                  auVar77 = vfmadd213ss_fma(auVar77,ZEXT416((uint)(fVar246 + fVar246)),
                                            ZEXT416((uint)(fVar246 * fVar246 * 3.0)));
                  auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar85,
                                            SUB6416(ZEXT464(0x40000000),0));
                  auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar210 * fVar210 * -3.0)),
                                            ZEXT416((uint)(fVar210 + fVar210)),auVar79);
                  auVar79 = vfmadd213ss_fma(ZEXT416((uint)local_820._0_4_),auVar85,
                                            ZEXT416((uint)local_800._0_4_));
                  fVar228 = auVar81._0_4_ * 0.5;
                  fVar230 = auVar77._0_4_ * 0.5;
                  fVar231 = auVar80._0_4_ * 0.5;
                  fVar232 = auVar79._0_4_ * 0.5;
                  auVar222._0_4_ = fVar232 * (float)local_7c0._0_4_;
                  auVar222._4_4_ = fVar232 * (float)local_7c0._4_4_;
                  auVar222._8_4_ = fVar232 * fStack_7b8;
                  auVar222._12_4_ = fVar232 * fStack_7b4;
                  auVar197._4_4_ = fVar231;
                  auVar197._0_4_ = fVar231;
                  auVar197._8_4_ = fVar231;
                  auVar197._12_4_ = fVar231;
                  auVar77 = vfmadd132ps_fma(auVar197,auVar222,local_780._0_16_);
                  auVar173._4_4_ = fVar230;
                  auVar173._0_4_ = fVar230;
                  auVar173._8_4_ = fVar230;
                  auVar173._12_4_ = fVar230;
                  auVar77 = vfmadd132ps_fma(auVar173,auVar77,local_7a0._0_16_);
                  auVar269._4_4_ = fVar228;
                  auVar269._0_4_ = fVar228;
                  auVar269._8_4_ = fVar228;
                  auVar269._12_4_ = fVar228;
                  auVar77 = vfmadd132ps_fma(auVar269,auVar77,local_760._0_16_);
                  local_800._0_16_ = vdpps_avx(auVar77,auVar77,0x7f);
                  auVar55._12_4_ = 0;
                  auVar55._0_12_ = ZEXT812(0);
                  fVar228 = local_800._0_4_;
                  auVar79 = vrsqrt14ss_avx512f(auVar55 << 0x20,ZEXT416((uint)fVar228));
                  fVar230 = auVar79._0_4_;
                  local_820._0_16_ = vrcp14ss_avx512f(auVar55 << 0x20,ZEXT416((uint)fVar228));
                  auVar27._8_4_ = 0x80000000;
                  auVar27._0_8_ = 0x8000000080000000;
                  auVar27._12_4_ = 0x80000000;
                  auVar80 = vxorps_avx512vl(local_800._0_16_,auVar27);
                  auVar79 = vfnmadd213ss_fma(local_820._0_16_,local_800._0_16_,
                                             SUB6416(ZEXT464(0x40000000),0));
                  uVar75 = auVar78._0_4_;
                  if (fVar228 < auVar80._0_4_) {
                    fVar231 = sqrtf(fVar228);
                    auVar78 = ZEXT416(uVar75);
                  }
                  else {
                    auVar80 = vsqrtss_avx(local_800._0_16_,local_800._0_16_);
                    fVar231 = auVar80._0_4_;
                  }
                  fVar228 = fVar230 * 1.5 + fVar228 * -0.5 * fVar230 * fVar230 * fVar230;
                  auVar156._0_4_ = auVar77._0_4_ * fVar228;
                  auVar156._4_4_ = auVar77._4_4_ * fVar228;
                  auVar156._8_4_ = auVar77._8_4_ * fVar228;
                  auVar156._12_4_ = auVar77._12_4_ * fVar228;
                  auVar80 = vdpps_avx(auVar2,auVar156,0x7f);
                  fVar210 = auVar78._0_4_;
                  fVar230 = auVar80._0_4_;
                  auVar157._0_4_ = fVar230 * fVar230;
                  auVar157._4_4_ = auVar80._4_4_ * auVar80._4_4_;
                  auVar157._8_4_ = auVar80._8_4_ * auVar80._8_4_;
                  auVar157._12_4_ = auVar80._12_4_ * auVar80._12_4_;
                  auVar81 = vsubps_avx512vl(auVar86,auVar157);
                  fVar232 = auVar81._0_4_;
                  auVar174._4_12_ = ZEXT812(0) << 0x20;
                  auVar174._0_4_ = fVar232;
                  auVar82 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar174);
                  auVar83 = vmulss_avx512f(auVar81,ZEXT416(0xbf000000));
                  if (fVar232 < 0.0) {
                    local_6d0 = fVar228;
                    fStack_6cc = fVar228;
                    fStack_6c8 = fVar228;
                    fStack_6c4 = fVar228;
                    local_6c0 = auVar82;
                    fVar232 = sqrtf(fVar232);
                    auVar83 = ZEXT416(auVar83._0_4_);
                    auVar78 = ZEXT416(uVar75);
                    auVar81 = local_6c0;
                    fVar228 = local_6d0;
                    fVar246 = fStack_6cc;
                    fVar247 = fStack_6c8;
                    fVar248 = fStack_6c4;
                  }
                  else {
                    auVar81 = vsqrtss_avx(auVar81,auVar81);
                    fVar232 = auVar81._0_4_;
                    auVar81 = auVar82;
                    fVar246 = fVar228;
                    fVar247 = fVar228;
                    fVar248 = fVar228;
                  }
                  auVar266 = ZEXT1664(auVar2);
                  auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar273 = ZEXT3264(auVar89);
                  auVar175._0_4_ = (float)local_6a0._0_4_ * (float)local_7c0._0_4_;
                  auVar175._4_4_ = (float)local_6a0._0_4_ * (float)local_7c0._4_4_;
                  auVar175._8_4_ = (float)local_6a0._0_4_ * fStack_7b8;
                  auVar175._12_4_ = (float)local_6a0._0_4_ * fStack_7b4;
                  auVar198._4_4_ = local_680._0_4_;
                  auVar198._0_4_ = local_680._0_4_;
                  auVar198._8_4_ = local_680._0_4_;
                  auVar198._12_4_ = local_680._0_4_;
                  auVar185 = vfmadd132ps_fma(auVar198,auVar175,local_780._0_16_);
                  auVar176._4_4_ = local_660._0_4_;
                  auVar176._0_4_ = local_660._0_4_;
                  auVar176._8_4_ = local_660._0_4_;
                  auVar176._12_4_ = local_660._0_4_;
                  auVar185 = vfmadd132ps_fma(auVar176,auVar185,local_7a0._0_16_);
                  auVar85 = vfmadd213ss_fma(auVar85,SUB6416(ZEXT464(0xc0400000),0),
                                            ZEXT416(0x40000000));
                  uVar166 = auVar85._0_4_;
                  auVar199._4_4_ = uVar166;
                  auVar199._0_4_ = uVar166;
                  auVar199._8_4_ = uVar166;
                  auVar199._12_4_ = uVar166;
                  auVar85 = vfmadd132ps_fma(auVar199,auVar185,local_760._0_16_);
                  auVar177._0_4_ = auVar85._0_4_ * (float)local_800._0_4_;
                  auVar177._4_4_ = auVar85._4_4_ * (float)local_800._0_4_;
                  auVar177._8_4_ = auVar85._8_4_ * (float)local_800._0_4_;
                  auVar177._12_4_ = auVar85._12_4_ * (float)local_800._0_4_;
                  auVar85 = vdpps_avx(auVar77,auVar85,0x7f);
                  fVar184 = auVar85._0_4_;
                  auVar200._0_4_ = auVar77._0_4_ * fVar184;
                  auVar200._4_4_ = auVar77._4_4_ * fVar184;
                  auVar200._8_4_ = auVar77._8_4_ * fVar184;
                  auVar200._12_4_ = auVar77._12_4_ * fVar184;
                  auVar85 = vsubps_avx(auVar177,auVar200);
                  fVar184 = auVar79._0_4_ * (float)local_820._0_4_;
                  auVar185 = vmaxss_avx(ZEXT416((uint)fVar233),
                                        ZEXT416((uint)(local_740._0_4_ * fVar212 * 1.9073486e-06)));
                  auVar28._8_4_ = 0x80000000;
                  auVar28._0_8_ = 0x8000000080000000;
                  auVar28._12_4_ = 0x80000000;
                  auVar84 = vxorps_avx512vl(auVar77,auVar28);
                  auVar201._0_4_ = fVar228 * auVar85._0_4_ * fVar184;
                  auVar201._4_4_ = fVar246 * auVar85._4_4_ * fVar184;
                  auVar201._8_4_ = fVar247 * auVar85._8_4_ * fVar184;
                  auVar201._12_4_ = fVar248 * auVar85._12_4_ * fVar184;
                  auVar267 = ZEXT1664(auVar156);
                  auVar85 = vdpps_avx(auVar84,auVar156,0x7f);
                  auVar79 = vfmadd213ss_fma(auVar78,ZEXT416((uint)fVar233),auVar185);
                  auVar78 = vdpps_avx(auVar2,auVar201,0x7f);
                  auVar213 = vfmadd213ss_fma(ZEXT416((uint)(fVar210 + 1.0)),
                                             ZEXT416((uint)(fVar233 / fVar231)),auVar79);
                  fVar228 = auVar85._0_4_ + auVar78._0_4_;
                  auVar78 = vdpps_avx(local_7d0,auVar156,0x7f);
                  auVar85 = vdpps_avx(auVar2,auVar84,0x7f);
                  auVar79 = vmulss_avx512f(auVar83,auVar81);
                  fVar231 = auVar82._0_4_ * 1.5 + auVar79._0_4_ * auVar81._0_4_ * auVar81._0_4_;
                  auVar79 = vdpps_avx(auVar2,local_7d0,0x7f);
                  auVar82 = vfnmadd231ss_fma(auVar85,auVar80,ZEXT416((uint)fVar228));
                  auVar79 = vfnmadd231ss_fma(auVar79,auVar80,auVar78);
                  auVar85 = vpermilps_avx(local_640._0_16_,0xff);
                  fVar232 = fVar232 - auVar85._0_4_;
                  auVar81 = vshufps_avx(auVar77,auVar77,0xff);
                  auVar85 = vfmsub213ss_fma(auVar82,ZEXT416((uint)fVar231),auVar81);
                  auVar258._8_4_ = 0x80000000;
                  auVar258._0_8_ = 0x8000000080000000;
                  auVar258._12_4_ = 0x80000000;
                  auVar260 = ZEXT1664(auVar258);
                  auVar253._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
                  auVar253._8_4_ = auVar85._8_4_ ^ 0x80000000;
                  auVar253._12_4_ = auVar85._12_4_ ^ 0x80000000;
                  auVar255 = ZEXT1664(auVar253);
                  auVar79 = ZEXT416((uint)(auVar79._0_4_ * fVar231));
                  auVar82 = vfmsub231ss_fma(ZEXT416((uint)(auVar78._0_4_ * auVar85._0_4_)),
                                            ZEXT416((uint)fVar228),auVar79);
                  auVar85 = vinsertps_avx(auVar253,auVar79,0x1c);
                  auVar242._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
                  auVar242._8_4_ = auVar78._8_4_ ^ 0x80000000;
                  auVar242._12_4_ = auVar78._12_4_ ^ 0x80000000;
                  auVar79 = vinsertps_avx(ZEXT416((uint)fVar228),auVar242,0x10);
                  auVar223._0_4_ = auVar82._0_4_;
                  auVar223._4_4_ = auVar223._0_4_;
                  auVar223._8_4_ = auVar223._0_4_;
                  auVar223._12_4_ = auVar223._0_4_;
                  auVar78 = vdivps_avx(auVar85,auVar223);
                  auVar85 = vdivps_avx(auVar79,auVar223);
                  auVar224._0_4_ = fVar230 * auVar78._0_4_ + fVar232 * auVar85._0_4_;
                  auVar224._4_4_ = fVar230 * auVar78._4_4_ + fVar232 * auVar85._4_4_;
                  auVar224._8_4_ = fVar230 * auVar78._8_4_ + fVar232 * auVar85._8_4_;
                  auVar224._12_4_ = fVar230 * auVar78._12_4_ + fVar232 * auVar85._12_4_;
                  auVar78 = vsubps_avx(local_740._0_16_,auVar224);
                  auVar29._8_4_ = 0x7fffffff;
                  auVar29._0_8_ = 0x7fffffff7fffffff;
                  auVar29._12_4_ = 0x7fffffff;
                  auVar85 = vandps_avx512vl(auVar80,auVar29);
                  if (auVar85._0_4_ < auVar213._0_4_) {
                    auVar85 = vfmadd231ss_fma(ZEXT416((uint)(auVar213._0_4_ + auVar185._0_4_)),
                                              local_6e0,ZEXT416(0x36000000));
                    auVar30._8_4_ = 0x7fffffff;
                    auVar30._0_8_ = 0x7fffffff7fffffff;
                    auVar30._12_4_ = 0x7fffffff;
                    auVar79 = vandps_avx512vl(ZEXT416((uint)fVar232),auVar30);
                    if (auVar79._0_4_ < auVar85._0_4_) {
                      fVar212 = auVar78._0_4_ + (float)local_6f0._0_4_;
                      if (fVar212 < fVar211) {
                        bVar70 = 0;
                        goto LAB_01e74acd;
                      }
                      fVar228 = *(float *)(ray + k * 4 + 0x100);
                      auVar255 = ZEXT464((uint)fVar228);
                      auVar183 = ZEXT3264(_local_840);
                      if (fVar212 <= fVar228) {
                        auVar85 = vmovshdup_avx(auVar78);
                        bVar70 = 0;
                        if ((auVar85._0_4_ < 0.0) || (1.0 < auVar85._0_4_)) goto LAB_01e74ad6;
                        auVar225._0_12_ = ZEXT812(0);
                        auVar225._12_4_ = 0;
                        auVar143._16_16_ = auVar139._16_16_;
                        auVar143._0_16_ = auVar225;
                        auVar142._4_28_ = auVar143._4_28_;
                        auVar142._0_4_ = fVar229;
                        auVar85 = vrsqrt14ss_avx512f(auVar225,auVar142._0_16_);
                        fVar229 = auVar85._0_4_;
                        auVar86 = vmulss_avx512f(auVar86,ZEXT416(0xbf000000));
                        pGVar4 = (context->scene->geometries).items[uVar66].ptr;
                        if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                          bVar70 = 0;
                          goto LAB_01e74ad6;
                        }
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (bVar70 = 1, pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0))
                        goto LAB_01e74ad6;
                        fVar229 = fVar229 * 1.5 + auVar86._0_4_ * fVar229 * fVar229 * fVar229;
                        auVar202._0_4_ = auVar2._0_4_ * fVar229;
                        auVar202._4_4_ = auVar2._4_4_ * fVar229;
                        auVar202._8_4_ = auVar2._8_4_ * fVar229;
                        auVar202._12_4_ = auVar2._12_4_ * fVar229;
                        auVar79 = vfmadd213ps_fma(auVar81,auVar202,auVar77);
                        auVar86 = vshufps_avx(auVar202,auVar202,0xc9);
                        auVar85 = vshufps_avx(auVar77,auVar77,0xc9);
                        auVar203._0_4_ = auVar202._0_4_ * auVar85._0_4_;
                        auVar203._4_4_ = auVar202._4_4_ * auVar85._4_4_;
                        auVar203._8_4_ = auVar202._8_4_ * auVar85._8_4_;
                        auVar203._12_4_ = auVar202._12_4_ * auVar85._12_4_;
                        auVar77 = vfmsub231ps_fma(auVar203,auVar77,auVar86);
                        auVar86 = vshufps_avx(auVar77,auVar77,0xc9);
                        auVar85 = vshufps_avx(auVar79,auVar79,0xc9);
                        auVar77 = vshufps_avx(auVar77,auVar77,0xd2);
                        auVar158._0_4_ = auVar79._0_4_ * auVar77._0_4_;
                        auVar158._4_4_ = auVar79._4_4_ * auVar77._4_4_;
                        auVar158._8_4_ = auVar79._8_4_ * auVar77._8_4_;
                        auVar158._12_4_ = auVar79._12_4_ * auVar77._12_4_;
                        auVar86 = vfmsub231ps_fma(auVar158,auVar86,auVar85);
                        auVar227._8_4_ = 1;
                        auVar227._0_8_ = 0x100000001;
                        auVar227._12_4_ = 1;
                        auVar227._16_4_ = 1;
                        auVar227._20_4_ = 1;
                        auVar227._24_4_ = 1;
                        auVar227._28_4_ = 1;
                        local_480 = vpermps_avx2(auVar227,ZEXT1632(auVar78));
                        auVar89 = vpermps_avx2(auVar227,ZEXT1632(auVar86));
                        auVar240._8_4_ = 2;
                        auVar240._0_8_ = 0x200000002;
                        auVar240._12_4_ = 2;
                        auVar240._16_4_ = 2;
                        auVar240._20_4_ = 2;
                        auVar240._24_4_ = 2;
                        auVar240._28_4_ = 2;
                        local_4c0 = vpermps_avx2(auVar240,ZEXT1632(auVar86));
                        local_4a0 = auVar86._0_4_;
                        local_4e0[0] = (RTCHitN)auVar89[0];
                        local_4e0[1] = (RTCHitN)auVar89[1];
                        local_4e0[2] = (RTCHitN)auVar89[2];
                        local_4e0[3] = (RTCHitN)auVar89[3];
                        local_4e0[4] = (RTCHitN)auVar89[4];
                        local_4e0[5] = (RTCHitN)auVar89[5];
                        local_4e0[6] = (RTCHitN)auVar89[6];
                        local_4e0[7] = (RTCHitN)auVar89[7];
                        local_4e0[8] = (RTCHitN)auVar89[8];
                        local_4e0[9] = (RTCHitN)auVar89[9];
                        local_4e0[10] = (RTCHitN)auVar89[10];
                        local_4e0[0xb] = (RTCHitN)auVar89[0xb];
                        local_4e0[0xc] = (RTCHitN)auVar89[0xc];
                        local_4e0[0xd] = (RTCHitN)auVar89[0xd];
                        local_4e0[0xe] = (RTCHitN)auVar89[0xe];
                        local_4e0[0xf] = (RTCHitN)auVar89[0xf];
                        local_4e0[0x10] = (RTCHitN)auVar89[0x10];
                        local_4e0[0x11] = (RTCHitN)auVar89[0x11];
                        local_4e0[0x12] = (RTCHitN)auVar89[0x12];
                        local_4e0[0x13] = (RTCHitN)auVar89[0x13];
                        local_4e0[0x14] = (RTCHitN)auVar89[0x14];
                        local_4e0[0x15] = (RTCHitN)auVar89[0x15];
                        local_4e0[0x16] = (RTCHitN)auVar89[0x16];
                        local_4e0[0x17] = (RTCHitN)auVar89[0x17];
                        local_4e0[0x18] = (RTCHitN)auVar89[0x18];
                        local_4e0[0x19] = (RTCHitN)auVar89[0x19];
                        local_4e0[0x1a] = (RTCHitN)auVar89[0x1a];
                        local_4e0[0x1b] = (RTCHitN)auVar89[0x1b];
                        local_4e0[0x1c] = (RTCHitN)auVar89[0x1c];
                        local_4e0[0x1d] = (RTCHitN)auVar89[0x1d];
                        local_4e0[0x1e] = (RTCHitN)auVar89[0x1e];
                        local_4e0[0x1f] = (RTCHitN)auVar89[0x1f];
                        uStack_49c = local_4a0;
                        uStack_498 = local_4a0;
                        uStack_494 = local_4a0;
                        uStack_490 = local_4a0;
                        uStack_48c = local_4a0;
                        uStack_488 = local_4a0;
                        uStack_484 = local_4a0;
                        local_460 = ZEXT432(0) << 0x20;
                        local_440 = local_500._0_8_;
                        uStack_438 = local_500._8_8_;
                        uStack_430 = local_500._16_8_;
                        uStack_428 = local_500._24_8_;
                        local_420 = local_520;
                        vpcmpeqd_avx2(local_520,local_520);
                        local_400 = context->user->instID[0];
                        uStack_3fc = local_400;
                        uStack_3f8 = local_400;
                        uStack_3f4 = local_400;
                        uStack_3f0 = local_400;
                        uStack_3ec = local_400;
                        uStack_3e8 = local_400;
                        uStack_3e4 = local_400;
                        local_3e0 = context->user->instPrimID[0];
                        uStack_3dc = local_3e0;
                        uStack_3d8 = local_3e0;
                        uStack_3d4 = local_3e0;
                        uStack_3d0 = local_3e0;
                        uStack_3cc = local_3e0;
                        uStack_3c8 = local_3e0;
                        uStack_3c4 = local_3e0;
                        *(float *)(ray + k * 4 + 0x100) = fVar212;
                        local_720 = local_560;
                        local_870.valid = (int *)local_720;
                        local_870.geometryUserPtr = pGVar4->userPtr;
                        local_870.context = context->user;
                        local_870.hit = local_4e0;
                        local_870.N = 8;
                        local_870.ray = (RTCRayN *)ray;
                        if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar260 = ZEXT1664(auVar258);
                          auVar266 = ZEXT1664(auVar2);
                          auVar267 = ZEXT1664(auVar156);
                          (*pGVar4->occlusionFilterN)(&local_870);
                          auVar183 = ZEXT3264(_local_840);
                          auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar273 = ZEXT3264(auVar89);
                        }
                        if (local_720 != (undefined1  [32])0x0) {
                          p_Var8 = context->args->filter;
                          if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar260 = ZEXT1664(auVar260._0_16_);
                            auVar266 = ZEXT1664(auVar266._0_16_);
                            auVar267 = ZEXT1664(auVar267._0_16_);
                            (*p_Var8)(&local_870);
                            auVar183 = ZEXT3264(_local_840);
                            auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar273 = ZEXT3264(auVar89);
                          }
                          auVar255 = ZEXT464((uint)fVar228);
                          uVar74 = vptestmd_avx512vl(local_720,local_720);
                          auVar89 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar9 = (bool)((byte)uVar74 & 1);
                          bVar10 = (bool)((byte)(uVar74 >> 1) & 1);
                          bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar74 >> 3) & 1);
                          bVar11 = (bool)((byte)(uVar74 >> 4) & 1);
                          bVar13 = (bool)((byte)(uVar74 >> 5) & 1);
                          bVar15 = (bool)((byte)(uVar74 >> 6) & 1);
                          bVar16 = SUB81(uVar74 >> 7,0);
                          *(uint *)(local_870.ray + 0x100) =
                               (uint)bVar9 * auVar89._0_4_ |
                               (uint)!bVar9 * *(int *)(local_870.ray + 0x100);
                          *(uint *)(local_870.ray + 0x104) =
                               (uint)bVar10 * auVar89._4_4_ |
                               (uint)!bVar10 * *(int *)(local_870.ray + 0x104);
                          *(uint *)(local_870.ray + 0x108) =
                               (uint)bVar12 * auVar89._8_4_ |
                               (uint)!bVar12 * *(int *)(local_870.ray + 0x108);
                          *(uint *)(local_870.ray + 0x10c) =
                               (uint)bVar14 * auVar89._12_4_ |
                               (uint)!bVar14 * *(int *)(local_870.ray + 0x10c);
                          *(uint *)(local_870.ray + 0x110) =
                               (uint)bVar11 * auVar89._16_4_ |
                               (uint)!bVar11 * *(int *)(local_870.ray + 0x110);
                          *(uint *)(local_870.ray + 0x114) =
                               (uint)bVar13 * auVar89._20_4_ |
                               (uint)!bVar13 * *(int *)(local_870.ray + 0x114);
                          *(uint *)(local_870.ray + 0x118) =
                               (uint)bVar15 * auVar89._24_4_ |
                               (uint)!bVar15 * *(int *)(local_870.ray + 0x118);
                          *(uint *)(local_870.ray + 0x11c) =
                               (uint)bVar16 * auVar89._28_4_ |
                               (uint)!bVar16 * *(int *)(local_870.ray + 0x11c);
                          bVar70 = 1;
                          if (local_720 != (undefined1  [32])0x0) goto LAB_01e74ad6;
                        }
                        *(float *)(ray + k * 4 + 0x100) = fVar228;
                      }
                      auVar255 = ZEXT464((uint)fVar228);
                      bVar70 = 0;
                      goto LAB_01e74ad6;
                    }
                  }
                  bVar73 = uVar74 < 4;
                  uVar74 = uVar74 + 1;
                } while (uVar74 != 5);
                bVar73 = false;
                bVar70 = 5;
LAB_01e74acd:
                auVar183 = ZEXT3264(_local_840);
LAB_01e74ad6:
                bVar72 = (bool)(bVar72 | bVar73 & bVar70);
                uVar166 = *(undefined4 *)(ray + k * 4 + 0x100);
                auVar164._4_4_ = uVar166;
                auVar164._0_4_ = uVar166;
                auVar164._8_4_ = uVar166;
                auVar164._12_4_ = uVar166;
                auVar164._16_4_ = uVar166;
                auVar164._20_4_ = uVar166;
                auVar164._24_4_ = uVar166;
                auVar164._28_4_ = uVar166;
                auVar57._4_4_ = fStack_59c;
                auVar57._0_4_ = local_5a0;
                auVar57._8_4_ = fStack_598;
                auVar57._12_4_ = fStack_594;
                auVar57._16_4_ = fStack_590;
                auVar57._20_4_ = fStack_58c;
                auVar57._24_4_ = fStack_588;
                auVar57._28_4_ = fStack_584;
                uVar18 = vcmpps_avx512vl(auVar164,auVar57,0xd);
                bVar61 = ~('\x01' << ((byte)iVar21 & 0x1f)) & bVar61 & (byte)uVar18;
                auVar140 = local_5c0;
              } while (bVar61 != 0);
            }
            uVar19 = vpcmpgtd_avx512vl(auVar140,local_540);
            uVar20 = vpcmpd_avx512vl(local_540,local_360,1);
            auVar208._0_4_ = fVar150 + (float)local_1c0._0_4_;
            auVar208._4_4_ = fVar150 + (float)local_1c0._4_4_;
            auVar208._8_4_ = fVar150 + fStack_1b8;
            auVar208._12_4_ = fVar150 + fStack_1b4;
            auVar208._16_4_ = fVar150 + fStack_1b0;
            auVar208._20_4_ = fVar150 + fStack_1ac;
            auVar208._24_4_ = fVar150 + fStack_1a8;
            auVar208._28_4_ = fVar150 + fStack_1a4;
            uVar18 = vcmpps_avx512vl(auVar208,auVar164,2);
            bVar65 = bVar65 & (byte)uVar20 & (byte)uVar18;
            auVar209._0_4_ = fVar150 + local_3c0._0_4_;
            auVar209._4_4_ = fVar150 + local_3c0._4_4_;
            auVar209._8_4_ = fVar150 + local_3c0._8_4_;
            auVar209._12_4_ = fVar150 + local_3c0._12_4_;
            auVar209._16_4_ = fVar150 + local_3c0._16_4_;
            auVar209._20_4_ = fVar150 + local_3c0._20_4_;
            auVar209._24_4_ = fVar150 + local_3c0._24_4_;
            auVar209._28_4_ = fVar150 + local_3c0._28_4_;
            uVar18 = vcmpps_avx512vl(auVar209,auVar164,2);
            bVar59 = bVar59 & (byte)uVar19 & (byte)uVar18 | bVar65;
            if (bVar59 != 0) {
              uVar64 = (ulong)uVar67;
              abStack_180[uVar64 * 0x60] = bVar59;
              bVar73 = (bool)(bVar65 >> 1 & 1);
              bVar9 = (bool)(bVar65 >> 2 & 1);
              bVar10 = (bool)(bVar65 >> 3 & 1);
              bVar12 = (bool)(bVar65 >> 4 & 1);
              bVar14 = (bool)(bVar65 >> 5 & 1);
              auStack_160[uVar64 * 0x18] =
                   (uint)(bVar65 & 1) * local_1c0._0_4_ |
                   (uint)!(bool)(bVar65 & 1) * (int)local_3c0._0_4_;
              auStack_160[uVar64 * 0x18 + 1] =
                   (uint)bVar73 * local_1c0._4_4_ | (uint)!bVar73 * (int)local_3c0._4_4_;
              auStack_160[uVar64 * 0x18 + 2] =
                   (uint)bVar9 * (int)fStack_1b8 | (uint)!bVar9 * (int)local_3c0._8_4_;
              auStack_160[uVar64 * 0x18 + 3] =
                   (uint)bVar10 * (int)fStack_1b4 | (uint)!bVar10 * (int)local_3c0._12_4_;
              auStack_160[uVar64 * 0x18 + 4] =
                   (uint)bVar12 * (int)fStack_1b0 | (uint)!bVar12 * (int)local_3c0._16_4_;
              auStack_160[uVar64 * 0x18 + 5] =
                   (uint)bVar14 * (int)fStack_1ac | (uint)!bVar14 * (int)local_3c0._20_4_;
              auStack_160[uVar64 * 0x18 + 6] =
                   (uint)(bVar65 >> 6) * (int)fStack_1a8 |
                   (uint)!(bool)(bVar65 >> 6) * (int)local_3c0._24_4_;
              (&fStack_144)[uVar64 * 0x18] = local_3c0._28_4_;
              uVar74 = vmovlps_avx(local_570);
              (&uStack_140)[uVar64 * 0xc] = uVar74;
              aiStack_138[uVar64 * 0x18] = iVar69 + 1;
              uVar67 = uVar67 + 1;
            }
          }
        }
      }
    }
    do {
      uVar75 = uVar67;
      uVar68 = uVar75 - 1;
      if (uVar75 == 0) {
        if (bVar72 != false) {
          return bVar72;
        }
        uVar166 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar36._4_4_ = uVar166;
        auVar36._0_4_ = uVar166;
        auVar36._8_4_ = uVar166;
        auVar36._12_4_ = uVar166;
        auVar36._16_4_ = uVar166;
        auVar36._20_4_ = uVar166;
        auVar36._24_4_ = uVar166;
        auVar36._28_4_ = uVar166;
        uVar18 = vcmpps_avx512vl(local_340,auVar36,2);
        uVar66 = (uint)uVar18 & (uint)local_6a8 - 1 & (uint)local_6a8;
        local_6a8 = (ulong)uVar66;
        if (uVar66 == 0) {
          return false;
        }
        goto LAB_01e72589;
      }
      uVar74 = (ulong)uVar68;
      auVar89 = *(undefined1 (*) [32])(auStack_160 + uVar74 * 0x18);
      auVar179._0_4_ = fVar150 + auVar89._0_4_;
      auVar179._4_4_ = fVar150 + auVar89._4_4_;
      auVar179._8_4_ = fVar150 + auVar89._8_4_;
      auVar179._12_4_ = fVar150 + auVar89._12_4_;
      auVar179._16_4_ = fVar150 + auVar89._16_4_;
      auVar179._20_4_ = fVar150 + auVar89._20_4_;
      auVar179._24_4_ = fVar150 + auVar89._24_4_;
      auVar179._28_4_ = fVar150 + auVar89._28_4_;
      uVar166 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar35._4_4_ = uVar166;
      auVar35._0_4_ = uVar166;
      auVar35._8_4_ = uVar166;
      auVar35._12_4_ = uVar166;
      auVar35._16_4_ = uVar166;
      auVar35._20_4_ = uVar166;
      auVar35._24_4_ = uVar166;
      auVar35._28_4_ = uVar166;
      uVar18 = vcmpps_avx512vl(auVar179,auVar35,2);
      uVar63 = (uint)uVar18 & (uint)abStack_180[uVar74 * 0x60];
      uVar67 = uVar68;
    } while (uVar63 == 0);
    uVar64 = (&uStack_140)[uVar74 * 0xc];
    auVar167._8_8_ = 0;
    auVar167._0_8_ = uVar64;
    auVar207._8_4_ = 0x7f800000;
    auVar207._0_8_ = 0x7f8000007f800000;
    auVar207._12_4_ = 0x7f800000;
    auVar207._16_4_ = 0x7f800000;
    auVar207._20_4_ = 0x7f800000;
    auVar207._24_4_ = 0x7f800000;
    auVar207._28_4_ = 0x7f800000;
    auVar100 = vblendmps_avx512vl(auVar207,auVar89);
    bVar59 = (byte)uVar63;
    auVar136._0_4_ =
         (uint)(bVar59 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar59 & 1) * (int)auVar89._0_4_;
    bVar73 = (bool)((byte)(uVar63 >> 1) & 1);
    auVar136._4_4_ = (uint)bVar73 * auVar100._4_4_ | (uint)!bVar73 * (int)auVar89._4_4_;
    bVar73 = (bool)((byte)(uVar63 >> 2) & 1);
    auVar136._8_4_ = (uint)bVar73 * auVar100._8_4_ | (uint)!bVar73 * (int)auVar89._8_4_;
    bVar73 = (bool)((byte)(uVar63 >> 3) & 1);
    auVar136._12_4_ = (uint)bVar73 * auVar100._12_4_ | (uint)!bVar73 * (int)auVar89._12_4_;
    bVar73 = (bool)((byte)(uVar63 >> 4) & 1);
    auVar136._16_4_ = (uint)bVar73 * auVar100._16_4_ | (uint)!bVar73 * (int)auVar89._16_4_;
    bVar73 = (bool)((byte)(uVar63 >> 5) & 1);
    auVar136._20_4_ = (uint)bVar73 * auVar100._20_4_ | (uint)!bVar73 * (int)auVar89._20_4_;
    bVar73 = (bool)((byte)(uVar63 >> 6) & 1);
    auVar136._24_4_ = (uint)bVar73 * auVar100._24_4_ | (uint)!bVar73 * (int)auVar89._24_4_;
    auVar136._28_4_ =
         (uVar63 >> 7) * auVar100._28_4_ | (uint)!SUB41(uVar63 >> 7,0) * (int)auVar89._28_4_;
    auVar89 = vshufps_avx(auVar136,auVar136,0xb1);
    auVar89 = vminps_avx(auVar136,auVar89);
    auVar100 = vshufpd_avx(auVar89,auVar89,5);
    auVar89 = vminps_avx(auVar89,auVar100);
    auVar100 = vpermpd_avx2(auVar89,0x4e);
    auVar89 = vminps_avx(auVar89,auVar100);
    uVar18 = vcmpps_avx512vl(auVar136,auVar89,0);
    bVar61 = (byte)uVar18 & bVar59;
    if (bVar61 != 0) {
      uVar63 = (uint)bVar61;
    }
    uVar144 = 0;
    for (; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x80000000) {
      uVar144 = uVar144 + 1;
    }
    iVar69 = aiStack_138[uVar74 * 0x18];
    bVar59 = ~('\x01' << ((byte)uVar144 & 0x1f)) & bVar59;
    abStack_180[uVar74 * 0x60] = bVar59;
    uVar67 = uVar75;
    if (bVar59 == 0) {
      uVar67 = uVar68;
    }
    uVar166 = (undefined4)uVar64;
    auVar161._4_4_ = uVar166;
    auVar161._0_4_ = uVar166;
    auVar161._8_4_ = uVar166;
    auVar161._12_4_ = uVar166;
    auVar161._16_4_ = uVar166;
    auVar161._20_4_ = uVar166;
    auVar161._24_4_ = uVar166;
    auVar161._28_4_ = uVar166;
    auVar78 = vmovshdup_avx(auVar167);
    auVar78 = vsubps_avx(auVar78,auVar167);
    auVar180._0_4_ = auVar78._0_4_;
    auVar180._4_4_ = auVar180._0_4_;
    auVar180._8_4_ = auVar180._0_4_;
    auVar180._12_4_ = auVar180._0_4_;
    auVar180._16_4_ = auVar180._0_4_;
    auVar180._20_4_ = auVar180._0_4_;
    auVar180._24_4_ = auVar180._0_4_;
    auVar180._28_4_ = auVar180._0_4_;
    auVar78 = vfmadd132ps_fma(auVar180,auVar161,_DAT_01faff20);
    auVar89 = ZEXT1632(auVar78);
    local_4e0[0] = (RTCHitN)auVar89[0];
    local_4e0[1] = (RTCHitN)auVar89[1];
    local_4e0[2] = (RTCHitN)auVar89[2];
    local_4e0[3] = (RTCHitN)auVar89[3];
    local_4e0[4] = (RTCHitN)auVar89[4];
    local_4e0[5] = (RTCHitN)auVar89[5];
    local_4e0[6] = (RTCHitN)auVar89[6];
    local_4e0[7] = (RTCHitN)auVar89[7];
    local_4e0[8] = (RTCHitN)auVar89[8];
    local_4e0[9] = (RTCHitN)auVar89[9];
    local_4e0[10] = (RTCHitN)auVar89[10];
    local_4e0[0xb] = (RTCHitN)auVar89[0xb];
    local_4e0[0xc] = (RTCHitN)auVar89[0xc];
    local_4e0[0xd] = (RTCHitN)auVar89[0xd];
    local_4e0[0xe] = (RTCHitN)auVar89[0xe];
    local_4e0[0xf] = (RTCHitN)auVar89[0xf];
    local_4e0[0x10] = (RTCHitN)auVar89[0x10];
    local_4e0[0x11] = (RTCHitN)auVar89[0x11];
    local_4e0[0x12] = (RTCHitN)auVar89[0x12];
    local_4e0[0x13] = (RTCHitN)auVar89[0x13];
    local_4e0[0x14] = (RTCHitN)auVar89[0x14];
    local_4e0[0x15] = (RTCHitN)auVar89[0x15];
    local_4e0[0x16] = (RTCHitN)auVar89[0x16];
    local_4e0[0x17] = (RTCHitN)auVar89[0x17];
    local_4e0[0x18] = (RTCHitN)auVar89[0x18];
    local_4e0[0x19] = (RTCHitN)auVar89[0x19];
    local_4e0[0x1a] = (RTCHitN)auVar89[0x1a];
    local_4e0[0x1b] = (RTCHitN)auVar89[0x1b];
    local_4e0[0x1c] = (RTCHitN)auVar89[0x1c];
    local_4e0[0x1d] = (RTCHitN)auVar89[0x1d];
    local_4e0[0x1e] = (RTCHitN)auVar89[0x1e];
    local_4e0[0x1f] = (RTCHitN)auVar89[0x1f];
    auVar183 = ZEXT864(*(ulong *)(local_4e0 + (ulong)uVar144 * 4));
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }